

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  byte bVar69;
  uint uVar70;
  byte bVar71;
  long lVar72;
  byte bVar73;
  ulong uVar74;
  long lVar75;
  bool bVar76;
  ulong uVar77;
  ulong uVar78;
  uint uVar79;
  uint uVar141;
  uint uVar142;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  uint uVar143;
  uint uVar147;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  float fVar148;
  vint4 bi_2;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar172;
  float fVar173;
  vint4 bi_1;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  vint4 bi;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  vint4 ai_2;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [64];
  vint4 ai_1;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  float fVar240;
  float fVar248;
  float fVar249;
  vint4 ai;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar250;
  float fVar252;
  undefined1 auVar246 [16];
  float fVar251;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar247 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  float fVar264;
  undefined1 auVar263 [64];
  undefined4 uVar265;
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_920 [16];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  ulong local_8c8;
  ulong local_8c0;
  uint local_8b4;
  uint local_8b0;
  undefined4 local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  RTCFilterFunctionNArguments local_860;
  undefined1 local_830 [16];
  Primitive *local_818;
  ulong local_810;
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  float local_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  uint local_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint uStack_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar136 [32];
  undefined1 auVar139 [32];
  
  PVar2 = prim[1];
  uVar78 = (ulong)(byte)PVar2;
  lVar75 = uVar78 * 0x25;
  fVar148 = *(float *)(prim + lVar75 + 0x12);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar84 = vsubps_avx(auVar84,*(undefined1 (*) [16])(prim + lVar75 + 6));
  auVar215._0_4_ = fVar148 * auVar84._0_4_;
  auVar215._4_4_ = fVar148 * auVar84._4_4_;
  auVar215._8_4_ = fVar148 * auVar84._8_4_;
  auVar215._12_4_ = fVar148 * auVar84._12_4_;
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 4 + 6)));
  auVar149._0_4_ = fVar148 * auVar83._0_4_;
  auVar149._4_4_ = fVar148 * auVar83._4_4_;
  auVar149._8_4_ = fVar148 * auVar83._8_4_;
  auVar149._12_4_ = fVar148 * auVar83._12_4_;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 5 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 6 + 6)));
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xf + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar78 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x1a + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x1b + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x1c + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar232._4_4_ = auVar149._0_4_;
  auVar232._0_4_ = auVar149._0_4_;
  auVar232._8_4_ = auVar149._0_4_;
  auVar232._12_4_ = auVar149._0_4_;
  auVar86 = vshufps_avx(auVar149,auVar149,0x55);
  auVar92 = vshufps_avx(auVar149,auVar149,0xaa);
  fVar148 = auVar92._0_4_;
  auVar195._0_4_ = fVar148 * auVar87._0_4_;
  fVar240 = auVar92._4_4_;
  auVar195._4_4_ = fVar240 * auVar87._4_4_;
  fVar248 = auVar92._8_4_;
  auVar195._8_4_ = fVar248 * auVar87._8_4_;
  fVar249 = auVar92._12_4_;
  auVar195._12_4_ = fVar249 * auVar87._12_4_;
  auVar174._0_4_ = auVar90._0_4_ * fVar148;
  auVar174._4_4_ = auVar90._4_4_ * fVar240;
  auVar174._8_4_ = auVar90._8_4_ * fVar248;
  auVar174._12_4_ = auVar90._12_4_ * fVar249;
  auVar150._0_4_ = auVar91._0_4_ * fVar148;
  auVar150._4_4_ = auVar91._4_4_ * fVar240;
  auVar150._8_4_ = auVar91._8_4_ * fVar248;
  auVar150._12_4_ = auVar91._12_4_ * fVar249;
  auVar92 = vfmadd231ps_fma(auVar195,auVar86,auVar83);
  auVar30 = vfmadd231ps_fma(auVar174,auVar86,auVar24);
  auVar86 = vfmadd231ps_fma(auVar150,auVar85,auVar86);
  auVar31 = vfmadd231ps_fma(auVar92,auVar232,auVar84);
  auVar30 = vfmadd231ps_fma(auVar30,auVar232,auVar88);
  auVar32 = vfmadd231ps_fma(auVar86,auVar89,auVar232);
  auVar268._4_4_ = auVar215._0_4_;
  auVar268._0_4_ = auVar215._0_4_;
  auVar268._8_4_ = auVar215._0_4_;
  auVar268._12_4_ = auVar215._0_4_;
  auVar86 = vshufps_avx(auVar215,auVar215,0x55);
  auVar92 = vshufps_avx(auVar215,auVar215,0xaa);
  fVar148 = auVar92._0_4_;
  auVar233._0_4_ = fVar148 * auVar87._0_4_;
  fVar240 = auVar92._4_4_;
  auVar233._4_4_ = fVar240 * auVar87._4_4_;
  fVar248 = auVar92._8_4_;
  auVar233._8_4_ = fVar248 * auVar87._8_4_;
  fVar249 = auVar92._12_4_;
  auVar233._12_4_ = fVar249 * auVar87._12_4_;
  auVar222._0_4_ = auVar90._0_4_ * fVar148;
  auVar222._4_4_ = auVar90._4_4_ * fVar240;
  auVar222._8_4_ = auVar90._8_4_ * fVar248;
  auVar222._12_4_ = auVar90._12_4_ * fVar249;
  auVar216._0_4_ = auVar91._0_4_ * fVar148;
  auVar216._4_4_ = auVar91._4_4_ * fVar240;
  auVar216._8_4_ = auVar91._8_4_ * fVar248;
  auVar216._12_4_ = auVar91._12_4_ * fVar249;
  auVar83 = vfmadd231ps_fma(auVar233,auVar86,auVar83);
  auVar87 = vfmadd231ps_fma(auVar222,auVar86,auVar24);
  auVar24 = vfmadd231ps_fma(auVar216,auVar86,auVar85);
  auVar33 = vfmadd231ps_fma(auVar83,auVar268,auVar84);
  auVar149 = vfmadd231ps_fma(auVar87,auVar268,auVar88);
  auVar260._8_4_ = 0x7fffffff;
  auVar260._0_8_ = 0x7fffffff7fffffff;
  auVar260._12_4_ = 0x7fffffff;
  auVar150 = vfmadd231ps_fma(auVar24,auVar268,auVar89);
  auVar84 = vandps_avx(auVar260,auVar31);
  auVar256._8_4_ = 0x219392ef;
  auVar256._0_8_ = 0x219392ef219392ef;
  auVar256._12_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar84,auVar256,1);
  bVar10 = (bool)((byte)uVar77 & 1);
  auVar80._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar31._0_4_;
  bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar31._4_4_;
  bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar31._8_4_;
  bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar31._12_4_;
  auVar84 = vandps_avx(auVar260,auVar30);
  uVar77 = vcmpps_avx512vl(auVar84,auVar256,1);
  bVar10 = (bool)((byte)uVar77 & 1);
  auVar81._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar30._0_4_;
  bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar30._4_4_;
  bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar30._8_4_;
  bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar30._12_4_;
  auVar84 = vandps_avx(auVar260,auVar32);
  uVar77 = vcmpps_avx512vl(auVar84,auVar256,1);
  bVar10 = (bool)((byte)uVar77 & 1);
  auVar82._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._0_4_;
  bVar10 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._4_4_;
  bVar10 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._8_4_;
  bVar10 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._12_4_;
  auVar83 = vrcp14ps_avx512vl(auVar80);
  auVar257._8_4_ = 0x3f800000;
  auVar257._0_8_ = &DAT_3f8000003f800000;
  auVar257._12_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar80,auVar83,auVar257);
  auVar31 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar84 = vfnmadd213ps_fma(auVar81,auVar83,auVar257);
  auVar32 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar82);
  auVar84 = vfnmadd213ps_fma(auVar82,auVar83,auVar257);
  auVar29 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  fVar148 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar75 + 0x16)) *
            *(float *)(prim + lVar75 + 0x1a);
  auVar241._4_4_ = fVar148;
  auVar241._0_4_ = fVar148;
  auVar241._8_4_ = fVar148;
  auVar241._12_4_ = fVar148;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar78 * 7 + 6);
  auVar84 = vpmovsxwd_avx(auVar84);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar88 = vsubps_avx(auVar83,auVar84);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar78 * 9 + 6);
  auVar83 = vpmovsxwd_avx(auVar87);
  auVar87 = vfmadd213ps_fma(auVar88,auVar241,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar83);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 * 0xd + 6);
  auVar83 = vpmovsxwd_avx(auVar88);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar88 = vfmadd213ps_fma(auVar83,auVar241,auVar84);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar78 * 0x12 + 6);
  auVar84 = vpmovsxwd_avx(auVar24);
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar77 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar78 * 2 + uVar77 + 6);
  auVar83 = vpmovsxwd_avx(auVar90);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar24 = vfmadd213ps_fma(auVar83,auVar241,auVar84);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar84 = vpmovsxwd_avx(auVar89);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar78 * 0x18 + 6);
  auVar83 = vpmovsxwd_avx(auVar85);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar90 = vfmadd213ps_fma(auVar83,auVar241,auVar84);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar78 * 0x1d + 6);
  auVar84 = vpmovsxwd_avx(auVar91);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar78 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar83 = vpmovsxwd_avx(auVar86);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar89 = vfmadd213ps_fma(auVar83,auVar241,auVar84);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar78) + 6);
  auVar84 = vpmovsxwd_avx(auVar92);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar78 * 0x23 + 6);
  auVar83 = vpmovsxwd_avx(auVar30);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar83 = vfmadd213ps_fma(auVar83,auVar241,auVar84);
  auVar84 = vsubps_avx(auVar87,auVar33);
  auVar242._0_4_ = auVar31._0_4_ * auVar84._0_4_;
  auVar242._4_4_ = auVar31._4_4_ * auVar84._4_4_;
  auVar242._8_4_ = auVar31._8_4_ * auVar84._8_4_;
  auVar242._12_4_ = auVar31._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar88,auVar33);
  auVar196._0_4_ = auVar31._0_4_ * auVar84._0_4_;
  auVar196._4_4_ = auVar31._4_4_ * auVar84._4_4_;
  auVar196._8_4_ = auVar31._8_4_ * auVar84._8_4_;
  auVar196._12_4_ = auVar31._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar24,auVar149);
  auVar234._0_4_ = auVar32._0_4_ * auVar84._0_4_;
  auVar234._4_4_ = auVar32._4_4_ * auVar84._4_4_;
  auVar234._8_4_ = auVar32._8_4_ * auVar84._8_4_;
  auVar234._12_4_ = auVar32._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar90,auVar149);
  auVar175._0_4_ = auVar32._0_4_ * auVar84._0_4_;
  auVar175._4_4_ = auVar32._4_4_ * auVar84._4_4_;
  auVar175._8_4_ = auVar32._8_4_ * auVar84._8_4_;
  auVar175._12_4_ = auVar32._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar89,auVar150);
  auVar223._0_4_ = auVar29._0_4_ * auVar84._0_4_;
  auVar223._4_4_ = auVar29._4_4_ * auVar84._4_4_;
  auVar223._8_4_ = auVar29._8_4_ * auVar84._8_4_;
  auVar223._12_4_ = auVar29._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar83,auVar150);
  auVar151._0_4_ = auVar29._0_4_ * auVar84._0_4_;
  auVar151._4_4_ = auVar29._4_4_ * auVar84._4_4_;
  auVar151._8_4_ = auVar29._8_4_ * auVar84._8_4_;
  auVar151._12_4_ = auVar29._12_4_ * auVar84._12_4_;
  auVar84 = vpminsd_avx(auVar242,auVar196);
  auVar83 = vpminsd_avx(auVar234,auVar175);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar83 = vpminsd_avx(auVar223,auVar151);
  uVar265 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar31._4_4_ = uVar265;
  auVar31._0_4_ = uVar265;
  auVar31._8_4_ = uVar265;
  auVar31._12_4_ = uVar265;
  auVar83 = vmaxps_avx512vl(auVar83,auVar31);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar32._8_4_ = 0x3f7ffffa;
  auVar32._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar32._12_4_ = 0x3f7ffffa;
  local_4b0 = vmulps_avx512vl(auVar84,auVar32);
  auVar84 = vpmaxsd_avx(auVar242,auVar196);
  auVar83 = vpmaxsd_avx(auVar234,auVar175);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar83 = vpmaxsd_avx(auVar223,auVar151);
  uVar265 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar29._4_4_ = uVar265;
  auVar29._0_4_ = uVar265;
  auVar29._8_4_ = uVar265;
  auVar29._12_4_ = uVar265;
  auVar83 = vminps_avx512vl(auVar83,auVar29);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar33._8_4_ = 0x3f800003;
  auVar33._0_8_ = 0x3f8000033f800003;
  auVar33._12_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar33);
  auVar83 = vpbroadcastd_avx512vl();
  uVar25 = vcmpps_avx512vl(local_4b0,auVar84,2);
  uVar77 = vpcmpgtd_avx512vl(auVar83,_DAT_01ff0cf0);
  uVar77 = ((byte)uVar25 & 0xf) & uVar77;
  if ((char)uVar77 == '\0') {
    return;
  }
  local_610 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar262 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar263 = ZEXT3264(_DAT_02020f20);
  local_818 = prim;
LAB_01c6ca8a:
  lVar75 = 0;
  for (uVar78 = uVar77; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar75 = lVar75 + 1;
  }
  uVar70 = *(uint *)(prim + 2);
  local_808 = (ulong)*(uint *)(prim + lVar75 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar70].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           local_808 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar148 = (pGVar4->time_range).lower;
  fVar148 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar148) / ((pGVar4->time_range).upper - fVar148));
  auVar84 = vroundss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),9);
  auVar84 = vminss_avx(auVar84,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar84 = vmaxss_avx(ZEXT816(0) << 0x20,auVar84);
  fVar148 = fVar148 - auVar84._0_4_;
  fVar240 = 1.0 - fVar148;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar72 = (long)(int)auVar84._0_4_ * 0x38;
  lVar6 = *(long *)(_Var5 + 0x10 + lVar72);
  lVar7 = *(long *)(_Var5 + 0x38 + lVar72);
  lVar8 = *(long *)(_Var5 + 0x48 + lVar72);
  pfVar1 = (float *)(lVar7 + lVar8 * uVar78);
  auVar152._0_4_ = fVar148 * *pfVar1;
  auVar152._4_4_ = fVar148 * pfVar1[1];
  auVar152._8_4_ = fVar148 * pfVar1[2];
  auVar152._12_4_ = fVar148 * pfVar1[3];
  lVar75 = uVar78 + 1;
  pfVar1 = (float *)(lVar7 + lVar8 * lVar75);
  auVar176._0_4_ = fVar148 * *pfVar1;
  auVar176._4_4_ = fVar148 * pfVar1[1];
  auVar176._8_4_ = fVar148 * pfVar1[2];
  auVar176._12_4_ = fVar148 * pfVar1[3];
  p_Var9 = pGVar4[4].occlusionFilterN;
  auVar197._4_4_ = fVar240;
  auVar197._0_4_ = fVar240;
  auVar197._8_4_ = fVar240;
  auVar197._12_4_ = fVar240;
  auVar88 = vfmadd231ps_fma(auVar152,auVar197,
                            *(undefined1 (*) [16])(*(long *)(_Var5 + lVar72) + lVar6 * uVar78));
  auVar24 = vfmadd231ps_fma(auVar176,auVar197,
                            *(undefined1 (*) [16])(*(long *)(_Var5 + lVar72) + lVar6 * lVar75));
  pfVar1 = (float *)(*(long *)(p_Var9 + lVar72 + 0x38) + uVar78 * *(long *)(p_Var9 + lVar72 + 0x48))
  ;
  auVar224._0_4_ = fVar148 * *pfVar1;
  auVar224._4_4_ = fVar148 * pfVar1[1];
  auVar224._8_4_ = fVar148 * pfVar1[2];
  auVar224._12_4_ = fVar148 * pfVar1[3];
  pfVar1 = (float *)(*(long *)(p_Var9 + lVar72 + 0x38) + *(long *)(p_Var9 + lVar72 + 0x48) * lVar75)
  ;
  auVar217._0_4_ = fVar148 * *pfVar1;
  auVar217._4_4_ = fVar148 * pfVar1[1];
  auVar217._8_4_ = fVar148 * pfVar1[2];
  auVar217._12_4_ = fVar148 * pfVar1[3];
  auVar87 = vfmadd231ps_fma(auVar224,auVar197,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var9 + lVar72) +
                             *(long *)(p_Var9 + lVar72 + 0x10) * uVar78));
  auVar90 = vfmadd231ps_fma(auVar217,auVar197,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var9 + lVar72) +
                             *(long *)(p_Var9 + lVar72 + 0x10) * lVar75));
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar83 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_880 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar270 = ZEXT3264(local_880);
  local_8a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar271 = ZEXT3264(local_8a0);
  auVar84 = vunpcklps_avx512vl(local_880._0_16_,local_8a0._0_16_);
  local_800 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar269 = ZEXT3264(local_800);
  auVar91 = local_800._0_16_;
  local_790 = vinsertps_avx512f(auVar84,auVar91,0x28);
  auVar235._8_4_ = 0xbeaaaaab;
  auVar235._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar235._12_4_ = 0xbeaaaaab;
  auVar89 = vfnmadd213ps_fma(auVar87,auVar235,auVar88);
  auVar87 = vfmadd213ps_fma(auVar90,auVar235,auVar24);
  auVar236._0_4_ = auVar24._0_4_ + auVar88._0_4_ + auVar89._0_4_ + auVar87._0_4_;
  auVar236._4_4_ = auVar24._4_4_ + auVar88._4_4_ + auVar89._4_4_ + auVar87._4_4_;
  auVar236._8_4_ = auVar24._8_4_ + auVar88._8_4_ + auVar89._8_4_ + auVar87._8_4_;
  auVar236._12_4_ = auVar24._12_4_ + auVar88._12_4_ + auVar89._12_4_ + auVar87._12_4_;
  auVar34._8_4_ = 0x3e800000;
  auVar34._0_8_ = 0x3e8000003e800000;
  auVar34._12_4_ = 0x3e800000;
  auVar84 = vmulps_avx512vl(auVar236,auVar34);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar84 = vdpps_avx(auVar84,local_790,0x7f);
  fVar148 = *(float *)(ray + k * 4 + 0x30);
  local_7a0 = vdpps_avx(local_790,local_790,0x7f);
  auVar243._4_12_ = ZEXT812(0) << 0x20;
  auVar243._0_4_ = local_7a0._0_4_;
  auVar85 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar243);
  auVar90 = vfnmadd213ss_fma(auVar85,local_7a0,ZEXT416(0x40000000));
  local_400 = auVar84._0_4_ * auVar85._0_4_ * auVar90._0_4_;
  auVar244._4_4_ = local_400;
  auVar244._0_4_ = local_400;
  auVar244._8_4_ = local_400;
  auVar244._12_4_ = local_400;
  fStack_770 = local_400;
  _local_780 = auVar244;
  fStack_76c = local_400;
  fStack_768 = local_400;
  fStack_764 = local_400;
  auVar84 = vfmadd231ps_fma(auVar83,local_790,auVar244);
  auVar84 = vblendps_avx(auVar84,ZEXT816(0) << 0x40,8);
  auVar83 = vsubps_avx(auVar88,auVar84);
  auVar87 = vsubps_avx(auVar87,auVar84);
  auVar88 = vsubps_avx(auVar89,auVar84);
  auVar84 = vsubps_avx(auVar24,auVar84);
  local_1e0 = auVar83._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar94._8_4_ = 1;
  auVar94._0_8_ = 0x100000001;
  auVar94._12_4_ = 1;
  auVar94._16_4_ = 1;
  auVar94._20_4_ = 1;
  auVar94._24_4_ = 1;
  auVar94._28_4_ = 1;
  local_680 = ZEXT1632(auVar83);
  local_200 = vpermps_avx2(auVar94,local_680);
  auVar95._8_4_ = 2;
  auVar95._0_8_ = 0x200000002;
  auVar95._12_4_ = 2;
  auVar95._16_4_ = 2;
  auVar95._20_4_ = 2;
  auVar95._24_4_ = 2;
  auVar95._28_4_ = 2;
  local_220 = vpermps_avx2(auVar95,local_680);
  auVar96._8_4_ = 3;
  auVar96._0_8_ = 0x300000003;
  auVar96._12_4_ = 3;
  auVar96._16_4_ = 3;
  auVar96._20_4_ = 3;
  auVar96._24_4_ = 3;
  auVar96._28_4_ = 3;
  local_240 = vpermps_avx2(auVar96,local_680);
  local_260 = auVar88._0_4_;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_6c0 = ZEXT1632(auVar88);
  local_280 = vpermps_avx2(auVar94,local_6c0);
  local_2a0 = vpermps_avx2(auVar95,local_6c0);
  local_2c0 = vpermps_avx2(auVar96,local_6c0);
  local_2e0 = auVar87._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_6a0 = ZEXT1632(auVar87);
  local_300 = vpermps_avx2(auVar94,local_6a0);
  local_320 = vpermps_avx2(auVar95,local_6a0);
  auVar231 = ZEXT3264(local_320);
  local_340 = vpermps_avx2(auVar96,local_6a0);
  uVar265 = auVar84._0_4_;
  local_360._4_4_ = uVar265;
  local_360._0_4_ = uVar265;
  fStack_358 = (float)uVar265;
  fStack_354 = (float)uVar265;
  fStack_350 = (float)uVar265;
  fStack_34c = (float)uVar265;
  fStack_348 = (float)uVar265;
  register0x000012dc = uVar265;
  auVar221 = ZEXT3264(_local_360);
  _local_6e0 = ZEXT1632(auVar84);
  _local_380 = vpermps_avx2(auVar94,_local_6e0);
  _local_3a0 = vpermps_avx2(auVar95,_local_6e0);
  _local_3c0 = vpermps_avx2(auVar96,_local_6e0);
  auVar84 = vmulss_avx512f(auVar91,auVar91);
  auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),local_8a0,local_8a0);
  auVar94 = vfmadd231ps_avx512vl(auVar94,local_880,local_880);
  local_3e0._0_4_ = auVar94._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  local_480 = vandps_avx(auVar262._0_32_,local_3e0);
  local_740 = ZEXT416((uint)local_400);
  local_400 = fVar148 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_5f0 = vpbroadcastd_avx512vl();
  local_600 = vpbroadcastd_avx512vl();
  local_810 = 1;
  local_8c8 = 0;
  auVar84 = vsqrtss_avx(local_7a0,local_7a0);
  local_8a4 = auVar84._0_4_;
  auVar84 = vsqrtss_avx(local_7a0,local_7a0);
  local_8a8 = auVar84._0_4_;
  auVar214 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_8c0 = uVar77;
  do {
    local_830 = auVar214._0_16_;
    auVar84 = vmovshdup_avx(local_830);
    auVar86 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    fVar240 = auVar214._0_4_;
    fVar173 = auVar84._0_4_ - fVar240;
    fVar264 = fVar173 * 0.04761905;
    auVar239._4_4_ = fVar240;
    auVar239._0_4_ = fVar240;
    auVar239._8_4_ = fVar240;
    auVar239._12_4_ = fVar240;
    auVar239._16_4_ = fVar240;
    auVar239._20_4_ = fVar240;
    auVar239._24_4_ = fVar240;
    auVar239._28_4_ = fVar240;
    local_7c0._4_4_ = fVar173;
    local_7c0._0_4_ = fVar173;
    local_7c0._8_4_ = fVar173;
    local_7c0._12_4_ = fVar173;
    local_7c0._16_4_ = fVar173;
    local_7c0._20_4_ = fVar173;
    local_7c0._24_4_ = fVar173;
    local_7c0._28_4_ = fVar173;
    auVar84 = vfmadd231ps_fma(auVar239,local_7c0,auVar263._0_32_);
    auVar121._8_4_ = 0x3f800000;
    auVar121._0_8_ = &DAT_3f8000003f800000;
    auVar121._12_4_ = 0x3f800000;
    auVar121._16_4_ = 0x3f800000;
    auVar121._20_4_ = 0x3f800000;
    auVar121._24_4_ = 0x3f800000;
    auVar121._28_4_ = 0x3f800000;
    auVar94 = vsubps_avx(auVar121,ZEXT1632(auVar84));
    auVar110._4_4_ = fStack_25c;
    auVar110._0_4_ = local_260;
    auVar110._8_4_ = fStack_258;
    auVar110._12_4_ = fStack_254;
    auVar110._16_4_ = fStack_250;
    auVar110._20_4_ = fStack_24c;
    auVar110._24_4_ = fStack_248;
    auVar110._28_4_ = fStack_244;
    fVar240 = auVar84._0_4_;
    auVar116._0_4_ = local_260 * fVar240;
    fVar248 = auVar84._4_4_;
    auVar116._4_4_ = fStack_25c * fVar248;
    fVar249 = auVar84._8_4_;
    auVar116._8_4_ = fStack_258 * fVar249;
    fVar251 = auVar84._12_4_;
    auVar116._12_4_ = fStack_254 * fVar251;
    auVar116._16_4_ = fStack_250 * 0.0;
    auVar116._20_4_ = fStack_24c * 0.0;
    auVar116._24_4_ = fStack_248 * 0.0;
    auVar116._28_4_ = 0;
    auVar262._0_4_ = local_280._0_4_ * fVar240;
    auVar262._4_4_ = local_280._4_4_ * fVar248;
    auVar262._8_4_ = local_280._8_4_ * fVar249;
    auVar262._12_4_ = local_280._12_4_ * fVar251;
    auVar262._16_4_ = local_280._16_4_ * 0.0;
    auVar262._20_4_ = local_280._20_4_ * 0.0;
    auVar262._28_36_ = auVar214._28_36_;
    auVar262._24_4_ = local_280._24_4_ * 0.0;
    auVar263._0_4_ = local_2a0._0_4_ * fVar240;
    auVar263._4_4_ = local_2a0._4_4_ * fVar248;
    auVar263._8_4_ = local_2a0._8_4_ * fVar249;
    auVar263._12_4_ = local_2a0._12_4_ * fVar251;
    auVar263._16_4_ = local_2a0._16_4_ * 0.0;
    auVar263._20_4_ = local_2a0._20_4_ * 0.0;
    auVar263._28_36_ = auVar221._28_36_;
    auVar263._24_4_ = local_2a0._24_4_ * 0.0;
    auVar214._0_4_ = local_2c0._0_4_ * fVar240;
    auVar214._4_4_ = local_2c0._4_4_ * fVar248;
    auVar214._8_4_ = local_2c0._8_4_ * fVar249;
    auVar214._12_4_ = local_2c0._12_4_ * fVar251;
    auVar214._16_4_ = local_2c0._16_4_ * 0.0;
    auVar214._20_4_ = local_2c0._20_4_ * 0.0;
    auVar214._28_36_ = auVar231._28_36_;
    auVar214._24_4_ = local_2c0._24_4_ * 0.0;
    auVar111._4_4_ = uStack_1dc;
    auVar111._0_4_ = local_1e0;
    auVar111._8_4_ = uStack_1d8;
    auVar111._12_4_ = uStack_1d4;
    auVar111._16_4_ = uStack_1d0;
    auVar111._20_4_ = uStack_1cc;
    auVar111._24_4_ = uStack_1c8;
    auVar111._28_4_ = uStack_1c4;
    auVar83 = vfmadd231ps_fma(auVar116,auVar94,auVar111);
    auVar87 = vfmadd231ps_fma(auVar262._0_32_,auVar94,local_200);
    auVar88 = vfmadd231ps_fma(auVar263._0_32_,auVar94,local_220);
    auVar24 = vfmadd231ps_fma(auVar214._0_32_,auVar94,local_240);
    auVar109._4_4_ = uStack_2dc;
    auVar109._0_4_ = local_2e0;
    auVar109._8_4_ = uStack_2d8;
    auVar109._12_4_ = uStack_2d4;
    auVar109._16_4_ = uStack_2d0;
    auVar109._20_4_ = uStack_2cc;
    auVar109._24_4_ = uStack_2c8;
    auVar109._28_4_ = uStack_2c4;
    auVar95 = vmulps_avx512vl(auVar109,ZEXT1632(auVar84));
    auVar102 = ZEXT1632(auVar84);
    auVar96 = vmulps_avx512vl(local_300,auVar102);
    auVar97 = vmulps_avx512vl(local_320,auVar102);
    auVar98 = vmulps_avx512vl(local_340,auVar102);
    auVar90 = vfmadd231ps_fma(auVar95,auVar94,auVar110);
    auVar89 = vfmadd231ps_fma(auVar96,auVar94,local_280);
    auVar85 = vfmadd231ps_fma(auVar97,auVar94,local_2a0);
    auVar91 = vfmadd231ps_fma(auVar98,auVar94,local_2c0);
    auVar97._4_4_ = fVar248 * (float)local_360._4_4_;
    auVar97._0_4_ = fVar240 * (float)local_360._0_4_;
    auVar97._8_4_ = fVar249 * fStack_358;
    auVar97._12_4_ = fVar251 * fStack_354;
    auVar97._16_4_ = fStack_350 * 0.0;
    auVar97._20_4_ = fStack_34c * 0.0;
    auVar97._24_4_ = fStack_348 * 0.0;
    auVar97._28_4_ = fStack_244;
    auVar103._4_4_ = fVar248 * (float)local_380._4_4_;
    auVar103._0_4_ = fVar240 * (float)local_380._0_4_;
    auVar103._8_4_ = fVar249 * fStack_378;
    auVar103._12_4_ = fVar251 * fStack_374;
    auVar103._16_4_ = fStack_370 * 0.0;
    auVar103._20_4_ = fStack_36c * 0.0;
    auVar103._24_4_ = fStack_368 * 0.0;
    auVar103._28_4_ = local_280._28_4_;
    auVar104._4_4_ = fVar248 * (float)local_3a0._4_4_;
    auVar104._0_4_ = fVar240 * (float)local_3a0._0_4_;
    auVar104._8_4_ = fVar249 * fStack_398;
    auVar104._12_4_ = fVar251 * fStack_394;
    auVar104._16_4_ = fStack_390 * 0.0;
    auVar104._20_4_ = fStack_38c * 0.0;
    auVar104._24_4_ = fStack_388 * 0.0;
    auVar104._28_4_ = local_2a0._28_4_;
    auVar105._4_4_ = fVar248 * (float)local_3c0._4_4_;
    auVar105._0_4_ = fVar240 * (float)local_3c0._0_4_;
    auVar105._8_4_ = fVar249 * fStack_3b8;
    auVar105._12_4_ = fVar251 * fStack_3b4;
    auVar105._16_4_ = fStack_3b0 * 0.0;
    auVar105._20_4_ = fStack_3ac * 0.0;
    auVar105._24_4_ = fStack_3a8 * 0.0;
    auVar105._28_4_ = local_2c0._28_4_;
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar109);
    auVar96 = vfmadd231ps_avx512vl(auVar103,auVar94,local_300);
    auVar97 = vfmadd231ps_avx512vl(auVar104,auVar94,local_320);
    auVar98 = vfmadd231ps_avx512vl(auVar105,auVar94,local_340);
    auVar99 = vmulps_avx512vl(auVar102,ZEXT1632(auVar90));
    auVar100 = vmulps_avx512vl(auVar102,ZEXT1632(auVar89));
    auVar101 = vmulps_avx512vl(auVar102,ZEXT1632(auVar85));
    auVar102 = vmulps_avx512vl(auVar102,ZEXT1632(auVar91));
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar83));
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,ZEXT1632(auVar87));
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar94,ZEXT1632(auVar88));
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,ZEXT1632(auVar24));
    auVar117._0_4_ = auVar95._0_4_ * fVar240;
    auVar117._4_4_ = auVar95._4_4_ * fVar248;
    auVar117._8_4_ = auVar95._8_4_ * fVar249;
    auVar117._12_4_ = auVar95._12_4_ * fVar251;
    auVar117._16_4_ = auVar95._16_4_ * 0.0;
    auVar117._20_4_ = auVar95._20_4_ * 0.0;
    auVar117._24_4_ = auVar95._24_4_ * 0.0;
    auVar117._28_4_ = 0;
    auVar106._4_4_ = auVar96._4_4_ * fVar248;
    auVar106._0_4_ = auVar96._0_4_ * fVar240;
    auVar106._8_4_ = auVar96._8_4_ * fVar249;
    auVar106._12_4_ = auVar96._12_4_ * fVar251;
    auVar106._16_4_ = auVar96._16_4_ * 0.0;
    auVar106._20_4_ = auVar96._20_4_ * 0.0;
    auVar106._24_4_ = auVar96._24_4_ * 0.0;
    auVar106._28_4_ = auVar95._28_4_;
    auVar107._4_4_ = auVar97._4_4_ * fVar248;
    auVar107._0_4_ = auVar97._0_4_ * fVar240;
    auVar107._8_4_ = auVar97._8_4_ * fVar249;
    auVar107._12_4_ = auVar97._12_4_ * fVar251;
    auVar107._16_4_ = auVar97._16_4_ * 0.0;
    auVar107._20_4_ = auVar97._20_4_ * 0.0;
    auVar107._24_4_ = auVar97._24_4_ * 0.0;
    auVar107._28_4_ = auVar96._28_4_;
    auVar108._4_4_ = auVar98._4_4_ * fVar248;
    auVar108._0_4_ = auVar98._0_4_ * fVar240;
    auVar108._8_4_ = auVar98._8_4_ * fVar249;
    auVar108._12_4_ = auVar98._12_4_ * fVar251;
    auVar108._16_4_ = auVar98._16_4_ * 0.0;
    auVar108._20_4_ = auVar98._20_4_ * 0.0;
    auVar108._24_4_ = auVar98._24_4_ * 0.0;
    auVar108._28_4_ = auVar97._28_4_;
    auVar83 = vfmadd231ps_fma(auVar117,auVar94,ZEXT1632(auVar90));
    auVar87 = vfmadd231ps_fma(auVar106,auVar94,ZEXT1632(auVar89));
    auVar88 = vfmadd231ps_fma(auVar107,auVar94,ZEXT1632(auVar85));
    auVar24 = vfmadd231ps_fma(auVar108,auVar94,ZEXT1632(auVar91));
    auVar95 = vmulps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar88));
    auVar103 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar251 * auVar83._12_4_,
                                             CONCAT48(fVar249 * auVar83._8_4_,
                                                      CONCAT44(fVar248 * auVar83._4_4_,
                                                               fVar240 * auVar83._0_4_)))),auVar94,
                          auVar99);
    auVar231 = ZEXT3264(auVar103);
    auVar104 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar87._12_4_ * fVar251,
                                             CONCAT48(auVar87._8_4_ * fVar249,
                                                      CONCAT44(auVar87._4_4_ * fVar248,
                                                               auVar87._0_4_ * fVar240)))),auVar94,
                          auVar100);
    auVar221 = ZEXT3264(auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar101);
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar24._12_4_ * fVar251,
                                            CONCAT48(auVar24._8_4_ * fVar249,
                                                     CONCAT44(auVar24._4_4_ * fVar248,
                                                              auVar24._0_4_ * fVar240)))),auVar102,
                         auVar94);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar83),auVar99);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar87),auVar100);
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar88),auVar101);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar24),auVar102);
    auVar123._0_4_ = fVar264 * auVar94._0_4_ * 3.0;
    auVar123._4_4_ = fVar264 * auVar94._4_4_ * 3.0;
    auVar123._8_4_ = fVar264 * auVar94._8_4_ * 3.0;
    auVar123._12_4_ = fVar264 * auVar94._12_4_ * 3.0;
    auVar123._16_4_ = fVar264 * auVar94._16_4_ * 3.0;
    auVar123._20_4_ = fVar264 * auVar94._20_4_ * 3.0;
    auVar123._24_4_ = fVar264 * auVar94._24_4_ * 3.0;
    auVar123._28_4_ = 0;
    auVar124._0_4_ = fVar264 * auVar95._0_4_ * 3.0;
    auVar124._4_4_ = fVar264 * auVar95._4_4_ * 3.0;
    auVar124._8_4_ = fVar264 * auVar95._8_4_ * 3.0;
    auVar124._12_4_ = fVar264 * auVar95._12_4_ * 3.0;
    auVar124._16_4_ = fVar264 * auVar95._16_4_ * 3.0;
    auVar124._20_4_ = fVar264 * auVar95._20_4_ * 3.0;
    auVar124._24_4_ = fVar264 * auVar95._24_4_ * 3.0;
    auVar124._28_4_ = 0;
    auVar125._0_4_ = auVar97._0_4_ * 3.0 * fVar264;
    auVar125._4_4_ = auVar97._4_4_ * 3.0 * fVar264;
    auVar125._8_4_ = auVar97._8_4_ * 3.0 * fVar264;
    auVar125._12_4_ = auVar97._12_4_ * 3.0 * fVar264;
    auVar125._16_4_ = auVar97._16_4_ * 3.0 * fVar264;
    auVar125._20_4_ = auVar97._20_4_ * 3.0 * fVar264;
    auVar125._24_4_ = auVar97._24_4_ * 3.0 * fVar264;
    auVar125._28_4_ = 0;
    fVar240 = auVar98._0_4_ * 3.0 * fVar264;
    fVar248 = auVar98._4_4_ * 3.0 * fVar264;
    auVar112._4_4_ = fVar248;
    auVar112._0_4_ = fVar240;
    fVar249 = auVar98._8_4_ * 3.0 * fVar264;
    auVar112._8_4_ = fVar249;
    fVar251 = auVar98._12_4_ * 3.0 * fVar264;
    auVar112._12_4_ = fVar251;
    fVar253 = auVar98._16_4_ * 3.0 * fVar264;
    auVar112._16_4_ = fVar253;
    fVar254 = auVar98._20_4_ * 3.0 * fVar264;
    auVar112._20_4_ = fVar254;
    fVar255 = auVar98._24_4_ * 3.0 * fVar264;
    auVar112._24_4_ = fVar255;
    auVar112._28_4_ = fVar264;
    auVar106 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,ZEXT1632(auVar86));
    auVar107 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,ZEXT1632(auVar86));
    auVar97 = ZEXT1632(auVar86);
    auVar108 = vpermt2ps_avx512vl(auVar105,_DAT_0205fd20,auVar97);
    auVar118._0_4_ = auVar96._0_4_ + fVar240;
    auVar118._4_4_ = auVar96._4_4_ + fVar248;
    auVar118._8_4_ = auVar96._8_4_ + fVar249;
    auVar118._12_4_ = auVar96._12_4_ + fVar251;
    auVar118._16_4_ = auVar96._16_4_ + fVar253;
    auVar118._20_4_ = auVar96._20_4_ + fVar254;
    auVar118._24_4_ = auVar96._24_4_ + fVar255;
    auVar118._28_4_ = auVar96._28_4_ + fVar264;
    auVar94 = vmaxps_avx(auVar96,auVar118);
    auVar95 = vminps_avx(auVar96,auVar118);
    auVar98 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,auVar97);
    auVar109 = vpermt2ps_avx512vl(auVar123,_DAT_0205fd20,auVar97);
    auVar110 = vpermt2ps_avx512vl(auVar124,_DAT_0205fd20,auVar97);
    auVar119 = ZEXT1632(auVar86);
    auVar111 = vpermt2ps_avx512vl(auVar125,_DAT_0205fd20,auVar119);
    auVar96 = vpermt2ps_avx512vl(auVar112,_DAT_0205fd20,auVar119);
    auVar99 = vsubps_avx512vl(auVar98,auVar96);
    auVar96 = vsubps_avx(auVar106,auVar103);
    auVar97 = vsubps_avx(auVar107,auVar104);
    auVar112 = vsubps_avx512vl(auVar108,auVar105);
    auVar100 = vmulps_avx512vl(auVar97,auVar125);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar124,auVar112);
    auVar101 = vmulps_avx512vl(auVar112,auVar123);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar125,auVar96);
    auVar102 = vmulps_avx512vl(auVar96,auVar124);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar123,auVar97);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar101 = vmulps_avx512vl(auVar112,auVar112);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar96);
    auVar102 = vrcp14ps_avx512vl(auVar101);
    auVar113 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar121);
    auVar102 = vfmadd132ps_avx512vl(auVar113,auVar102,auVar102);
    auVar100 = vmulps_avx512vl(auVar100,auVar102);
    auVar113 = vmulps_avx512vl(auVar97,auVar111);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar110,auVar112);
    auVar114 = vmulps_avx512vl(auVar112,auVar109);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar111,auVar96);
    auVar115 = vmulps_avx512vl(auVar96,auVar110);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar109,auVar97);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar102 = vmulps_avx512vl(auVar113,auVar102);
    auVar100 = vmaxps_avx512vl(auVar100,auVar102);
    auVar100 = vsqrtps_avx512vl(auVar100);
    auVar102 = vmaxps_avx512vl(auVar99,auVar98);
    auVar94 = vmaxps_avx512vl(auVar94,auVar102);
    auVar102 = vaddps_avx512vl(auVar100,auVar94);
    auVar94 = vminps_avx512vl(auVar99,auVar98);
    auVar94 = vminps_avx(auVar95,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar100);
    auVar98._8_4_ = 0x3f800002;
    auVar98._0_8_ = 0x3f8000023f800002;
    auVar98._12_4_ = 0x3f800002;
    auVar98._16_4_ = 0x3f800002;
    auVar98._20_4_ = 0x3f800002;
    auVar98._24_4_ = 0x3f800002;
    auVar98._28_4_ = 0x3f800002;
    auVar95 = vmulps_avx512vl(auVar102,auVar98);
    auVar99._8_4_ = 0x3f7ffffc;
    auVar99._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar99._12_4_ = 0x3f7ffffc;
    auVar99._16_4_ = 0x3f7ffffc;
    auVar99._20_4_ = 0x3f7ffffc;
    auVar99._24_4_ = 0x3f7ffffc;
    auVar99._28_4_ = 0x3f7ffffc;
    local_7e0 = vmulps_avx512vl(auVar94,auVar99);
    auVar113._4_4_ = auVar95._4_4_ * auVar95._4_4_;
    auVar113._0_4_ = auVar95._0_4_ * auVar95._0_4_;
    auVar113._8_4_ = auVar95._8_4_ * auVar95._8_4_;
    auVar113._12_4_ = auVar95._12_4_ * auVar95._12_4_;
    auVar113._16_4_ = auVar95._16_4_ * auVar95._16_4_;
    auVar113._20_4_ = auVar95._20_4_ * auVar95._20_4_;
    auVar113._24_4_ = auVar95._24_4_ * auVar95._24_4_;
    auVar113._28_4_ = local_7e0._28_4_;
    auVar94 = vrsqrt14ps_avx512vl(auVar101);
    auVar100._8_4_ = 0xbf000000;
    auVar100._0_8_ = 0xbf000000bf000000;
    auVar100._12_4_ = 0xbf000000;
    auVar100._16_4_ = 0xbf000000;
    auVar100._20_4_ = 0xbf000000;
    auVar100._24_4_ = 0xbf000000;
    auVar100._28_4_ = 0xbf000000;
    auVar95 = vmulps_avx512vl(auVar101,auVar100);
    auVar114._4_4_ = auVar94._4_4_ * auVar95._4_4_;
    auVar114._0_4_ = auVar94._0_4_ * auVar95._0_4_;
    auVar114._8_4_ = auVar94._8_4_ * auVar95._8_4_;
    auVar114._12_4_ = auVar94._12_4_ * auVar95._12_4_;
    auVar114._16_4_ = auVar94._16_4_ * auVar95._16_4_;
    auVar114._20_4_ = auVar94._20_4_ * auVar95._20_4_;
    auVar114._24_4_ = auVar94._24_4_ * auVar95._24_4_;
    auVar114._28_4_ = auVar95._28_4_;
    auVar95 = vmulps_avx512vl(auVar94,auVar94);
    auVar95 = vmulps_avx512vl(auVar95,auVar114);
    auVar101._8_4_ = 0x3fc00000;
    auVar101._0_8_ = 0x3fc000003fc00000;
    auVar101._12_4_ = 0x3fc00000;
    auVar101._16_4_ = 0x3fc00000;
    auVar101._20_4_ = 0x3fc00000;
    auVar101._24_4_ = 0x3fc00000;
    auVar101._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar101);
    auVar115._4_4_ = auVar95._4_4_ * auVar96._4_4_;
    auVar115._0_4_ = auVar95._0_4_ * auVar96._0_4_;
    auVar115._8_4_ = auVar95._8_4_ * auVar96._8_4_;
    auVar115._12_4_ = auVar95._12_4_ * auVar96._12_4_;
    auVar115._16_4_ = auVar95._16_4_ * auVar96._16_4_;
    auVar115._20_4_ = auVar95._20_4_ * auVar96._20_4_;
    auVar115._24_4_ = auVar95._24_4_ * auVar96._24_4_;
    auVar115._28_4_ = auVar94._28_4_;
    auVar94 = vmulps_avx512vl(auVar97,auVar95);
    auVar98 = vmulps_avx512vl(auVar112,auVar95);
    auVar99 = vsubps_avx512vl(auVar119,auVar103);
    auVar100 = vsubps_avx512vl(auVar119,auVar104);
    auVar101 = vsubps_avx512vl(auVar119,auVar105);
    auVar102 = vmulps_avx512vl(auVar269._0_32_,auVar101);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar271._0_32_,auVar100);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar270._0_32_,auVar99);
    auVar114 = vmulps_avx512vl(auVar101,auVar101);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar100,auVar100);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar99,auVar99);
    auVar116 = vmulps_avx512vl(auVar269._0_32_,auVar98);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar94,auVar271._0_32_);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar270._0_32_);
    auVar98 = vmulps_avx512vl(auVar101,auVar98);
    auVar94 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar94);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar115);
    local_640 = vmulps_avx512vl(auVar116,auVar116);
    auVar98 = vsubps_avx512vl(local_3e0,local_640);
    auVar115 = vmulps_avx512vl(auVar116,auVar94);
    auVar102 = vsubps_avx512vl(auVar102,auVar115);
    auVar115 = vaddps_avx512vl(auVar102,auVar102);
    auVar102 = vmulps_avx512vl(auVar94,auVar94);
    auVar114 = vsubps_avx512vl(auVar114,auVar102);
    auVar113 = vsubps_avx512vl(auVar114,auVar113);
    auVar117 = vmulps_avx512vl(auVar115,auVar115);
    auVar102._8_4_ = 0x40800000;
    auVar102._0_8_ = 0x4080000040800000;
    auVar102._12_4_ = 0x40800000;
    auVar102._16_4_ = 0x40800000;
    auVar102._20_4_ = 0x40800000;
    auVar102._24_4_ = 0x40800000;
    auVar102._28_4_ = 0x40800000;
    auVar102 = vmulps_avx512vl(auVar98,auVar102);
    auVar118 = vmulps_avx512vl(auVar102,auVar113);
    auVar118 = vsubps_avx512vl(auVar117,auVar118);
    uVar78 = vcmpps_avx512vl(auVar118,auVar119,5);
    bVar71 = (byte)uVar78;
    if (bVar71 == 0) {
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      in_ZMM31 = ZEXT3264(auVar113);
    }
    else {
      auVar118 = vsqrtps_avx512vl(auVar118);
      auVar119 = vaddps_avx512vl(auVar98,auVar98);
      auVar120 = vrcp14ps_avx512vl(auVar119);
      auVar121 = vfnmadd213ps_avx512vl(auVar119,auVar120,auVar121);
      auVar121 = vfmadd132ps_avx512vl(auVar121,auVar120,auVar120);
      auVar120._8_4_ = 0x80000000;
      auVar120._0_8_ = 0x8000000080000000;
      auVar120._12_4_ = 0x80000000;
      auVar120._16_4_ = 0x80000000;
      auVar120._20_4_ = 0x80000000;
      auVar120._24_4_ = 0x80000000;
      auVar120._28_4_ = 0x80000000;
      auVar119 = vxorps_avx512vl(auVar115,auVar120);
      auVar119 = vsubps_avx512vl(auVar119,auVar118);
      auVar119 = vmulps_avx512vl(auVar119,auVar121);
      auVar118 = vsubps_avx512vl(auVar118,auVar115);
      auVar118 = vmulps_avx512vl(auVar118,auVar121);
      auVar121 = vfmadd213ps_avx512vl(auVar116,auVar119,auVar94);
      local_4e0 = vmulps_avx512vl(auVar95,auVar121);
      auVar121 = vfmadd213ps_avx512vl(auVar116,auVar118,auVar94);
      local_500 = vmulps_avx512vl(auVar95,auVar121);
      auVar161._8_4_ = 0x7f800000;
      auVar161._0_8_ = 0x7f8000007f800000;
      auVar161._12_4_ = 0x7f800000;
      auVar161._16_4_ = 0x7f800000;
      auVar161._20_4_ = 0x7f800000;
      auVar161._24_4_ = 0x7f800000;
      auVar161._28_4_ = 0x7f800000;
      auVar121 = vblendmps_avx512vl(auVar161,auVar119);
      auVar119._0_4_ =
           (uint)(bVar71 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar71 & 1) * local_500._0_4_;
      bVar10 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar10 * auVar121._4_4_ | (uint)!bVar10 * local_500._4_4_;
      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar10 * auVar121._8_4_ | (uint)!bVar10 * local_500._8_4_;
      bVar10 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar10 * auVar121._12_4_ | (uint)!bVar10 * local_500._12_4_;
      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar10 * auVar121._16_4_ | (uint)!bVar10 * local_500._16_4_;
      bVar10 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar10 * auVar121._20_4_ | (uint)!bVar10 * local_500._20_4_;
      bVar10 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar10 * auVar121._24_4_ | (uint)!bVar10 * local_500._24_4_;
      bVar10 = SUB81(uVar78 >> 7,0);
      auVar119._28_4_ = (uint)bVar10 * auVar121._28_4_ | (uint)!bVar10 * local_500._28_4_;
      auVar162._8_4_ = 0xff800000;
      auVar162._0_8_ = 0xff800000ff800000;
      auVar162._12_4_ = 0xff800000;
      auVar162._16_4_ = 0xff800000;
      auVar162._20_4_ = 0xff800000;
      auVar162._24_4_ = 0xff800000;
      auVar162._28_4_ = 0xff800000;
      auVar121 = vblendmps_avx512vl(auVar162,auVar118);
      auVar122._0_4_ =
           (uint)(bVar71 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar118._0_4_;
      bVar10 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar10 * auVar121._4_4_ | (uint)!bVar10 * auVar118._4_4_;
      bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar10 * auVar121._8_4_ | (uint)!bVar10 * auVar118._8_4_;
      bVar10 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar10 * auVar121._12_4_ | (uint)!bVar10 * auVar118._12_4_;
      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar10 * auVar121._16_4_ | (uint)!bVar10 * auVar118._16_4_;
      bVar10 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar10 * auVar121._20_4_ | (uint)!bVar10 * auVar118._20_4_;
      bVar10 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar10 * auVar121._24_4_ | (uint)!bVar10 * auVar118._24_4_;
      bVar10 = SUB81(uVar78 >> 7,0);
      auVar122._28_4_ = (uint)bVar10 * auVar121._28_4_ | (uint)!bVar10 * auVar118._28_4_;
      in_ZMM31 = ZEXT3264(auVar122);
      auVar163._8_4_ = 0x7fffffff;
      auVar163._0_8_ = 0x7fffffff7fffffff;
      auVar163._12_4_ = 0x7fffffff;
      auVar163._16_4_ = 0x7fffffff;
      auVar163._20_4_ = 0x7fffffff;
      auVar163._24_4_ = 0x7fffffff;
      auVar163._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_640,auVar163);
      auVar118 = vmaxps_avx512vl(local_480,auVar122);
      auVar126._8_4_ = 0x36000000;
      auVar126._0_8_ = 0x3600000036000000;
      auVar126._12_4_ = 0x36000000;
      auVar126._16_4_ = 0x36000000;
      auVar126._20_4_ = 0x36000000;
      auVar126._24_4_ = 0x36000000;
      auVar126._28_4_ = 0x36000000;
      auVar121 = vmulps_avx512vl(auVar118,auVar126);
      auVar118 = vandps_avx(auVar98,auVar163);
      uVar74 = vcmpps_avx512vl(auVar118,auVar121,1);
      uVar78 = uVar78 & uVar74;
      bVar73 = (byte)uVar78;
      if (bVar73 != 0) {
        uVar74 = vcmpps_avx512vl(auVar113,_DAT_02020f00,2);
        auVar189._8_4_ = 0xff800000;
        auVar189._0_8_ = 0xff800000ff800000;
        auVar189._12_4_ = 0xff800000;
        auVar189._16_4_ = 0xff800000;
        auVar189._20_4_ = 0xff800000;
        auVar189._24_4_ = 0xff800000;
        auVar189._28_4_ = 0xff800000;
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar121 = vblendmps_avx512vl(auVar113,auVar189);
        bVar69 = (byte)uVar74;
        uVar79 = (uint)(bVar69 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar118._0_4_;
        bVar10 = (bool)((byte)(uVar74 >> 1) & 1);
        uVar141 = (uint)bVar10 * auVar121._4_4_ | (uint)!bVar10 * auVar118._4_4_;
        bVar10 = (bool)((byte)(uVar74 >> 2) & 1);
        uVar142 = (uint)bVar10 * auVar121._8_4_ | (uint)!bVar10 * auVar118._8_4_;
        bVar10 = (bool)((byte)(uVar74 >> 3) & 1);
        uVar143 = (uint)bVar10 * auVar121._12_4_ | (uint)!bVar10 * auVar118._12_4_;
        bVar10 = (bool)((byte)(uVar74 >> 4) & 1);
        uVar144 = (uint)bVar10 * auVar121._16_4_ | (uint)!bVar10 * auVar118._16_4_;
        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
        uVar145 = (uint)bVar10 * auVar121._20_4_ | (uint)!bVar10 * auVar118._20_4_;
        bVar10 = (bool)((byte)(uVar74 >> 6) & 1);
        uVar146 = (uint)bVar10 * auVar121._24_4_ | (uint)!bVar10 * auVar118._24_4_;
        bVar10 = SUB81(uVar74 >> 7,0);
        uVar147 = (uint)bVar10 * auVar121._28_4_ | (uint)!bVar10 * auVar118._28_4_;
        auVar119._0_4_ = (bVar73 & 1) * uVar79 | !(bool)(bVar73 & 1) * auVar119._0_4_;
        bVar10 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar119._4_4_ = bVar10 * uVar141 | !bVar10 * auVar119._4_4_;
        bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar119._8_4_ = bVar10 * uVar142 | !bVar10 * auVar119._8_4_;
        bVar10 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar119._12_4_ = bVar10 * uVar143 | !bVar10 * auVar119._12_4_;
        bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar119._16_4_ = bVar10 * uVar144 | !bVar10 * auVar119._16_4_;
        bVar10 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar119._20_4_ = bVar10 * uVar145 | !bVar10 * auVar119._20_4_;
        bVar10 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar119._24_4_ = bVar10 * uVar146 | !bVar10 * auVar119._24_4_;
        bVar10 = SUB81(uVar78 >> 7,0);
        auVar119._28_4_ = bVar10 * uVar147 | !bVar10 * auVar119._28_4_;
        auVar113 = vblendmps_avx512vl(auVar189,auVar113);
        bVar10 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar74 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar74 >> 5) & 1);
        bVar19 = (bool)((byte)(uVar74 >> 6) & 1);
        bVar21 = SUB81(uVar74 >> 7,0);
        bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar78 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar78 >> 6) & 1);
        bVar22 = SUB81(uVar78 >> 7,0);
        in_ZMM31 = ZEXT3264(CONCAT428((uint)bVar22 *
                                      ((uint)bVar21 * auVar113._28_4_ | !bVar21 * uVar147) |
                                      !bVar22 * auVar122._28_4_,
                                      CONCAT424((uint)bVar20 *
                                                ((uint)bVar19 * auVar113._24_4_ | !bVar19 * uVar146)
                                                | !bVar20 * auVar122._24_4_,
                                                CONCAT420((uint)bVar18 *
                                                          ((uint)bVar17 * auVar113._20_4_ |
                                                          !bVar17 * uVar145) |
                                                          !bVar18 * auVar122._20_4_,
                                                          CONCAT416((uint)bVar16 *
                                                                    ((uint)bVar15 * auVar113._16_4_
                                                                    | !bVar15 * uVar144) |
                                                                    !bVar16 * auVar122._16_4_,
                                                                    CONCAT412((uint)bVar14 *
                                                                              ((uint)bVar13 *
                                                                               auVar113._12_4_ |
                                                                              !bVar13 * uVar143) |
                                                                              !bVar14 * auVar122.
                                                  _12_4_,CONCAT48((uint)bVar12 *
                                                                  ((uint)bVar11 * auVar113._8_4_ |
                                                                  !bVar11 * uVar142) |
                                                                  !bVar12 * auVar122._8_4_,
                                                                  CONCAT44((uint)bVar76 *
                                                                           ((uint)bVar10 *
                                                                            auVar113._4_4_ |
                                                                           !bVar10 * uVar141) |
                                                                           !bVar76 * auVar122._4_4_,
                                                                           (uint)(bVar73 & 1) *
                                                                           ((uint)(bVar69 & 1) *
                                                                            auVar113._0_4_ |
                                                                           !(bool)(bVar69 & 1) *
                                                                           uVar79) | !(bool)(bVar73 
                                                  & 1) * auVar122._0_4_))))))));
        bVar71 = (~bVar73 | bVar69) & bVar71;
      }
    }
    if ((bVar71 & 0x7f) == 0) {
LAB_01c6d82c:
      auVar269 = ZEXT3264(local_800);
      auVar263 = ZEXT3264(_DAT_02020f20);
      auVar271 = ZEXT3264(local_8a0);
      auVar270 = ZEXT3264(local_880);
      auVar262 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
    }
    else {
      fVar240 = *(float *)(ray + k * 4 + 0x80) - (float)local_740._0_4_;
      auVar164._4_4_ = fVar240;
      auVar164._0_4_ = fVar240;
      auVar164._8_4_ = fVar240;
      auVar164._12_4_ = fVar240;
      auVar164._16_4_ = fVar240;
      auVar164._20_4_ = fVar240;
      auVar164._24_4_ = fVar240;
      auVar164._28_4_ = fVar240;
      auVar113 = vminps_avx512vl(auVar164,in_ZMM31._0_32_);
      auVar67._4_4_ = fStack_3fc;
      auVar67._0_4_ = local_400;
      auVar67._8_4_ = fStack_3f8;
      auVar67._12_4_ = fStack_3f4;
      auVar67._16_4_ = fStack_3f0;
      auVar67._20_4_ = fStack_3ec;
      auVar67._24_4_ = fStack_3e8;
      auVar67._28_4_ = fStack_3e4;
      auVar118 = vmaxps_avx512vl(auVar67,auVar119);
      auVar101 = vmulps_avx512vl(auVar101,auVar125);
      auVar100 = vfmadd213ps_avx512vl(auVar100,auVar124,auVar101);
      auVar99 = vfmadd213ps_avx512vl(auVar99,auVar123,auVar100);
      auVar269 = ZEXT3264(local_800);
      auVar100 = vmulps_avx512vl(local_800,auVar125);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_8a0,auVar124);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_880,auVar123);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar100,auVar101);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar25 = vcmpps_avx512vl(auVar101,auVar121,1);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar123);
      auVar99 = vxorps_avx512vl(auVar99,auVar123);
      auVar124 = vrcp14ps_avx512vl(auVar100);
      auVar125 = vxorps_avx512vl(auVar100,auVar123);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar120 = vfnmadd213ps_avx512vl(auVar124,auVar100,auVar119);
      auVar120 = vfmadd132ps_avx512vl(auVar120,auVar124,auVar124);
      auVar120 = vmulps_avx512vl(auVar120,auVar99);
      uVar26 = vcmpps_avx512vl(auVar100,auVar125,1);
      bVar73 = (byte)uVar25 | (byte)uVar26;
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar99 = vblendmps_avx512vl(auVar120,auVar126);
      auVar127._0_4_ =
           (uint)(bVar73 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar124._0_4_;
      bVar10 = (bool)(bVar73 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar10 * auVar99._4_4_ | (uint)!bVar10 * auVar124._4_4_;
      bVar10 = (bool)(bVar73 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar10 * auVar99._8_4_ | (uint)!bVar10 * auVar124._8_4_;
      bVar10 = (bool)(bVar73 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar10 * auVar99._12_4_ | (uint)!bVar10 * auVar124._12_4_;
      bVar10 = (bool)(bVar73 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar10 * auVar99._16_4_ | (uint)!bVar10 * auVar124._16_4_;
      bVar10 = (bool)(bVar73 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar10 * auVar99._20_4_ | (uint)!bVar10 * auVar124._20_4_;
      bVar10 = (bool)(bVar73 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar10 * auVar99._24_4_ | (uint)!bVar10 * auVar124._24_4_;
      auVar127._28_4_ =
           (uint)(bVar73 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar124._28_4_;
      auVar99 = vmaxps_avx(auVar118,auVar127);
      uVar26 = vcmpps_avx512vl(auVar100,auVar125,6);
      bVar73 = (byte)uVar25 | (byte)uVar26;
      auVar128._0_4_ = (uint)(bVar73 & 1) * 0x7f800000 | (uint)!(bool)(bVar73 & 1) * auVar120._0_4_;
      bVar10 = (bool)(bVar73 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar120._4_4_;
      bVar10 = (bool)(bVar73 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar120._8_4_;
      bVar10 = (bool)(bVar73 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar120._12_4_;
      bVar10 = (bool)(bVar73 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar120._16_4_;
      bVar10 = (bool)(bVar73 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar120._20_4_;
      bVar10 = (bool)(bVar73 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * auVar120._24_4_;
      auVar128._28_4_ =
           (uint)(bVar73 >> 7) * 0x7f800000 | (uint)!(bool)(bVar73 >> 7) * auVar120._28_4_;
      auVar100 = vminps_avx(auVar113,auVar128);
      auVar84 = vxorps_avx512vl(auVar125._0_16_,auVar125._0_16_);
      auVar106 = vsubps_avx512vl(ZEXT1632(auVar84),auVar106);
      auVar107 = vsubps_avx512vl(ZEXT1632(auVar84),auVar107);
      auVar118 = ZEXT1632(auVar84);
      auVar108 = vsubps_avx512vl(auVar118,auVar108);
      auVar50._4_4_ = auVar108._4_4_ * auVar111._4_4_;
      auVar50._0_4_ = auVar108._0_4_ * auVar111._0_4_;
      auVar50._8_4_ = auVar108._8_4_ * auVar111._8_4_;
      auVar50._12_4_ = auVar108._12_4_ * auVar111._12_4_;
      auVar50._16_4_ = auVar108._16_4_ * auVar111._16_4_;
      auVar50._20_4_ = auVar108._20_4_ * auVar111._20_4_;
      auVar50._24_4_ = auVar108._24_4_ * auVar111._24_4_;
      auVar50._28_4_ = auVar108._28_4_;
      auVar107 = vfnmsub231ps_avx512vl(auVar50,auVar110,auVar107);
      auVar106 = vfnmadd231ps_avx512vl(auVar107,auVar109,auVar106);
      auVar107 = vmulps_avx512vl(local_800,auVar111);
      auVar107 = vfnmsub231ps_avx512vl(auVar107,local_8a0,auVar110);
      auVar107 = vfnmadd231ps_avx512vl(auVar107,local_880,auVar109);
      vandps_avx512vl(auVar107,auVar101);
      uVar25 = vcmpps_avx512vl(auVar107,auVar121,1);
      auVar101 = vxorps_avx512vl(auVar106,auVar123);
      auVar106 = vrcp14ps_avx512vl(auVar107);
      auVar108 = vxorps_avx512vl(auVar107,auVar123);
      auVar113 = vfnmadd213ps_avx512vl(auVar106,auVar107,auVar119);
      auVar84 = vfmadd132ps_fma(auVar113,auVar106,auVar106);
      fVar240 = auVar84._0_4_ * auVar101._0_4_;
      fVar248 = auVar84._4_4_ * auVar101._4_4_;
      auVar51._4_4_ = fVar248;
      auVar51._0_4_ = fVar240;
      fVar249 = auVar84._8_4_ * auVar101._8_4_;
      auVar51._8_4_ = fVar249;
      fVar251 = auVar84._12_4_ * auVar101._12_4_;
      auVar51._12_4_ = fVar251;
      fVar264 = auVar101._16_4_ * 0.0;
      auVar51._16_4_ = fVar264;
      fVar253 = auVar101._20_4_ * 0.0;
      auVar51._20_4_ = fVar253;
      fVar254 = auVar101._24_4_ * 0.0;
      auVar51._24_4_ = fVar254;
      auVar51._28_4_ = auVar101._28_4_;
      uVar26 = vcmpps_avx512vl(auVar107,auVar108,1);
      bVar73 = (byte)uVar25 | (byte)uVar26;
      auVar113 = vblendmps_avx512vl(auVar51,auVar126);
      auVar129._0_4_ =
           (uint)(bVar73 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar106._0_4_;
      bVar10 = (bool)(bVar73 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar10 * auVar113._4_4_ | (uint)!bVar10 * auVar106._4_4_;
      bVar10 = (bool)(bVar73 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar10 * auVar113._8_4_ | (uint)!bVar10 * auVar106._8_4_;
      bVar10 = (bool)(bVar73 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar10 * auVar113._12_4_ | (uint)!bVar10 * auVar106._12_4_;
      bVar10 = (bool)(bVar73 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar10 * auVar113._16_4_ | (uint)!bVar10 * auVar106._16_4_;
      bVar10 = (bool)(bVar73 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar10 * auVar113._20_4_ | (uint)!bVar10 * auVar106._20_4_;
      bVar10 = (bool)(bVar73 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar10 * auVar113._24_4_ | (uint)!bVar10 * auVar106._24_4_;
      auVar129._28_4_ =
           (uint)(bVar73 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar106._28_4_;
      _local_660 = vmaxps_avx(auVar99,auVar129);
      uVar26 = vcmpps_avx512vl(auVar107,auVar108,6);
      bVar73 = (byte)uVar25 | (byte)uVar26;
      auVar130._0_4_ = (uint)(bVar73 & 1) * 0x7f800000 | (uint)!(bool)(bVar73 & 1) * (int)fVar240;
      bVar10 = (bool)(bVar73 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar248;
      bVar10 = (bool)(bVar73 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar249;
      bVar10 = (bool)(bVar73 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar251;
      bVar10 = (bool)(bVar73 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar264;
      bVar10 = (bool)(bVar73 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar253;
      bVar10 = (bool)(bVar73 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar10 * 0x7f800000 | (uint)!bVar10 * (int)fVar254;
      auVar130._28_4_ =
           (uint)(bVar73 >> 7) * 0x7f800000 | (uint)!(bool)(bVar73 >> 7) * auVar101._28_4_;
      local_440 = vminps_avx(auVar100,auVar130);
      uVar25 = vcmpps_avx512vl(_local_660,local_440,2);
      bVar71 = bVar71 & 0x7f & (byte)uVar25;
      if (bVar71 == 0) goto LAB_01c6d82c;
      auVar101 = vmaxps_avx512vl(auVar118,local_7e0);
      auVar99 = vminps_avx512vl(local_4e0,auVar119);
      auVar57 = ZEXT412(0);
      auVar100 = ZEXT1232(auVar57) << 0x20;
      auVar99 = vmaxps_avx(auVar99,ZEXT1232(auVar57) << 0x20);
      auVar106 = vminps_avx512vl(local_500,auVar119);
      auVar52._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar99._28_4_ + 7.0;
      auVar84 = vfmadd213ps_fma(auVar52,local_7c0,auVar239);
      local_4e0 = ZEXT1632(auVar84);
      auVar99 = vmaxps_avx(auVar106,ZEXT1232(auVar57) << 0x20);
      auVar53._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar99._28_4_ + 7.0;
      auVar84 = vfmadd213ps_fma(auVar53,local_7c0,auVar239);
      local_500 = ZEXT1632(auVar84);
      auVar165._0_4_ = auVar101._0_4_ * auVar101._0_4_;
      auVar165._4_4_ = auVar101._4_4_ * auVar101._4_4_;
      auVar165._8_4_ = auVar101._8_4_ * auVar101._8_4_;
      auVar165._12_4_ = auVar101._12_4_ * auVar101._12_4_;
      auVar165._16_4_ = auVar101._16_4_ * auVar101._16_4_;
      auVar165._20_4_ = auVar101._20_4_ * auVar101._20_4_;
      auVar165._24_4_ = auVar101._24_4_ * auVar101._24_4_;
      auVar165._28_4_ = 0;
      auVar99 = vsubps_avx(auVar114,auVar165);
      auVar101 = vmulps_avx512vl(auVar102,auVar99);
      auVar101 = vsubps_avx512vl(auVar117,auVar101);
      uVar25 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar57) << 0x20,5);
      bVar73 = (byte)uVar25;
      if (bVar73 == 0) {
        auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar131._8_4_ = 0x7f800000;
        auVar131._0_8_ = 0x7f8000007f800000;
        auVar131._12_4_ = 0x7f800000;
        auVar131._16_4_ = 0x7f800000;
        auVar131._20_4_ = 0x7f800000;
        auVar131._24_4_ = 0x7f800000;
        auVar131._28_4_ = 0x7f800000;
        auVar132._8_4_ = 0xff800000;
        auVar132._0_8_ = 0xff800000ff800000;
        auVar132._12_4_ = 0xff800000;
        auVar132._16_4_ = 0xff800000;
        auVar132._20_4_ = 0xff800000;
        auVar132._24_4_ = 0xff800000;
        auVar132._28_4_ = 0xff800000;
      }
      else {
        auVar83 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
        uVar78 = vcmpps_avx512vl(auVar101,auVar118,5);
        auVar100 = vsqrtps_avx(auVar101);
        auVar190._0_4_ = auVar98._0_4_ + auVar98._0_4_;
        auVar190._4_4_ = auVar98._4_4_ + auVar98._4_4_;
        auVar190._8_4_ = auVar98._8_4_ + auVar98._8_4_;
        auVar190._12_4_ = auVar98._12_4_ + auVar98._12_4_;
        auVar190._16_4_ = auVar98._16_4_ + auVar98._16_4_;
        auVar190._20_4_ = auVar98._20_4_ + auVar98._20_4_;
        auVar190._24_4_ = auVar98._24_4_ + auVar98._24_4_;
        auVar190._28_4_ = auVar98._28_4_ + auVar98._28_4_;
        auVar101 = vrcp14ps_avx512vl(auVar190);
        auVar102 = vfnmadd213ps_avx512vl(auVar190,auVar101,auVar119);
        auVar84 = vfmadd132ps_fma(auVar102,auVar101,auVar101);
        auVar42._8_4_ = 0x80000000;
        auVar42._0_8_ = 0x8000000080000000;
        auVar42._12_4_ = 0x80000000;
        auVar42._16_4_ = 0x80000000;
        auVar42._20_4_ = 0x80000000;
        auVar42._24_4_ = 0x80000000;
        auVar42._28_4_ = 0x80000000;
        auVar101 = vxorps_avx512vl(auVar115,auVar42);
        auVar101 = vsubps_avx(auVar101,auVar100);
        auVar54._4_4_ = auVar101._4_4_ * auVar84._4_4_;
        auVar54._0_4_ = auVar101._0_4_ * auVar84._0_4_;
        auVar54._8_4_ = auVar101._8_4_ * auVar84._8_4_;
        auVar54._12_4_ = auVar101._12_4_ * auVar84._12_4_;
        auVar54._16_4_ = auVar101._16_4_ * 0.0;
        auVar54._20_4_ = auVar101._20_4_ * 0.0;
        auVar54._24_4_ = auVar101._24_4_ * 0.0;
        auVar54._28_4_ = 0x3e000000;
        auVar100 = vsubps_avx512vl(auVar100,auVar115);
        auVar55._4_4_ = auVar100._4_4_ * auVar84._4_4_;
        auVar55._0_4_ = auVar100._0_4_ * auVar84._0_4_;
        auVar55._8_4_ = auVar100._8_4_ * auVar84._8_4_;
        auVar55._12_4_ = auVar100._12_4_ * auVar84._12_4_;
        auVar55._16_4_ = auVar100._16_4_ * 0.0;
        auVar55._20_4_ = auVar100._20_4_ * 0.0;
        auVar55._24_4_ = auVar100._24_4_ * 0.0;
        auVar55._28_4_ = fVar173;
        auVar100 = vfmadd213ps_avx512vl(auVar116,auVar54,auVar94);
        auVar56._4_4_ = auVar95._4_4_ * auVar100._4_4_;
        auVar56._0_4_ = auVar95._0_4_ * auVar100._0_4_;
        auVar56._8_4_ = auVar95._8_4_ * auVar100._8_4_;
        auVar56._12_4_ = auVar95._12_4_ * auVar100._12_4_;
        auVar56._16_4_ = auVar95._16_4_ * auVar100._16_4_;
        auVar56._20_4_ = auVar95._20_4_ * auVar100._20_4_;
        auVar56._24_4_ = auVar95._24_4_ * auVar100._24_4_;
        auVar56._28_4_ = auVar101._28_4_;
        auVar100 = vmulps_avx512vl(local_880,auVar54);
        auVar101 = vmulps_avx512vl(local_8a0,auVar54);
        auVar107 = vmulps_avx512vl(local_800,auVar54);
        auVar102 = vfmadd213ps_avx512vl(auVar96,auVar56,auVar103);
        auVar102 = vsubps_avx512vl(auVar100,auVar102);
        auVar100 = vfmadd213ps_avx512vl(auVar97,auVar56,auVar104);
        auVar106 = vsubps_avx512vl(auVar101,auVar100);
        auVar84 = vfmadd213ps_fma(auVar56,auVar112,auVar105);
        auVar101 = vsubps_avx(auVar107,ZEXT1632(auVar84));
        auVar94 = vfmadd213ps_avx512vl(auVar116,auVar55,auVar94);
        auVar95 = vmulps_avx512vl(auVar95,auVar94);
        auVar94 = vmulps_avx512vl(local_880,auVar55);
        auVar107 = vmulps_avx512vl(local_8a0,auVar55);
        auVar108 = vmulps_avx512vl(local_800,auVar55);
        auVar84 = vfmadd213ps_fma(auVar96,auVar95,auVar103);
        auVar100 = vsubps_avx(auVar94,ZEXT1632(auVar84));
        auVar84 = vfmadd213ps_fma(auVar97,auVar95,auVar104);
        auVar94 = vsubps_avx512vl(auVar107,ZEXT1632(auVar84));
        auVar84 = vfmadd213ps_fma(auVar112,auVar95,auVar105);
        auVar95 = vsubps_avx512vl(auVar108,ZEXT1632(auVar84));
        auVar210._8_4_ = 0x7f800000;
        auVar210._0_8_ = 0x7f8000007f800000;
        auVar210._12_4_ = 0x7f800000;
        auVar210._16_4_ = 0x7f800000;
        auVar210._20_4_ = 0x7f800000;
        auVar210._24_4_ = 0x7f800000;
        auVar210._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar210,auVar54);
        bVar10 = (bool)((byte)uVar78 & 1);
        auVar131._0_4_ = (uint)bVar10 * auVar96._0_4_ | (uint)!bVar10 * auVar103._0_4_;
        bVar10 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * auVar103._4_4_;
        bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * auVar103._8_4_;
        bVar10 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * auVar103._12_4_;
        bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar10 * auVar96._16_4_ | (uint)!bVar10 * auVar103._16_4_;
        bVar10 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar10 * auVar96._20_4_ | (uint)!bVar10 * auVar103._20_4_;
        bVar10 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar10 * auVar96._24_4_ | (uint)!bVar10 * auVar103._24_4_;
        bVar10 = SUB81(uVar78 >> 7,0);
        auVar131._28_4_ = (uint)bVar10 * auVar96._28_4_ | (uint)!bVar10 * auVar103._28_4_;
        auVar211._8_4_ = 0xff800000;
        auVar211._0_8_ = 0xff800000ff800000;
        auVar211._12_4_ = 0xff800000;
        auVar211._16_4_ = 0xff800000;
        auVar211._20_4_ = 0xff800000;
        auVar211._24_4_ = 0xff800000;
        auVar211._28_4_ = 0xff800000;
        auVar96 = vblendmps_avx512vl(auVar211,auVar55);
        bVar10 = (bool)((byte)uVar78 & 1);
        auVar132._0_4_ = (uint)bVar10 * auVar96._0_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar10 * auVar96._16_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar10 * auVar96._20_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar10 * auVar96._24_4_ | (uint)!bVar10 * -0x800000;
        bVar10 = SUB81(uVar78 >> 7,0);
        auVar132._28_4_ = (uint)bVar10 * auVar96._28_4_ | (uint)!bVar10 * -0x800000;
        auVar258._8_4_ = 0x7fffffff;
        auVar258._0_8_ = 0x7fffffff7fffffff;
        auVar258._12_4_ = 0x7fffffff;
        auVar258._16_4_ = 0x7fffffff;
        auVar258._20_4_ = 0x7fffffff;
        auVar258._24_4_ = 0x7fffffff;
        auVar258._28_4_ = 0x7fffffff;
        auVar96 = vandps_avx(auVar258,local_640);
        auVar96 = vmaxps_avx(local_480,auVar96);
        auVar43._8_4_ = 0x36000000;
        auVar43._0_8_ = 0x3600000036000000;
        auVar43._12_4_ = 0x36000000;
        auVar43._16_4_ = 0x36000000;
        auVar43._20_4_ = 0x36000000;
        auVar43._24_4_ = 0x36000000;
        auVar43._28_4_ = 0x36000000;
        auVar97 = vmulps_avx512vl(auVar96,auVar43);
        auVar96 = vandps_avx(auVar98,auVar258);
        uVar74 = vcmpps_avx512vl(auVar96,auVar97,1);
        uVar78 = uVar78 & uVar74;
        bVar69 = (byte)uVar78;
        if (bVar69 != 0) {
          uVar74 = vcmpps_avx512vl(auVar99,ZEXT1632(auVar83),2);
          auVar259._8_4_ = 0xff800000;
          auVar259._0_8_ = 0xff800000ff800000;
          auVar259._12_4_ = 0xff800000;
          auVar259._16_4_ = 0xff800000;
          auVar259._20_4_ = 0xff800000;
          auVar259._24_4_ = 0xff800000;
          auVar259._28_4_ = 0xff800000;
          auVar267._8_4_ = 0x7f800000;
          auVar267._0_8_ = 0x7f8000007f800000;
          auVar267._12_4_ = 0x7f800000;
          auVar267._16_4_ = 0x7f800000;
          auVar267._20_4_ = 0x7f800000;
          auVar267._24_4_ = 0x7f800000;
          auVar267._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar267,auVar259);
          bVar68 = (byte)uVar74;
          uVar79 = (uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar97._0_4_;
          bVar10 = (bool)((byte)(uVar74 >> 1) & 1);
          uVar141 = (uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * auVar97._4_4_;
          bVar10 = (bool)((byte)(uVar74 >> 2) & 1);
          uVar142 = (uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * auVar97._8_4_;
          bVar10 = (bool)((byte)(uVar74 >> 3) & 1);
          uVar143 = (uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * auVar97._12_4_;
          bVar10 = (bool)((byte)(uVar74 >> 4) & 1);
          uVar144 = (uint)bVar10 * auVar96._16_4_ | (uint)!bVar10 * auVar97._16_4_;
          bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
          uVar145 = (uint)bVar10 * auVar96._20_4_ | (uint)!bVar10 * auVar97._20_4_;
          bVar10 = (bool)((byte)(uVar74 >> 6) & 1);
          uVar146 = (uint)bVar10 * auVar96._24_4_ | (uint)!bVar10 * auVar97._24_4_;
          bVar10 = SUB81(uVar74 >> 7,0);
          uVar147 = (uint)bVar10 * auVar96._28_4_ | (uint)!bVar10 * auVar97._28_4_;
          auVar131._0_4_ = (bVar69 & 1) * uVar79 | !(bool)(bVar69 & 1) * auVar131._0_4_;
          bVar10 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar131._4_4_ = bVar10 * uVar141 | !bVar10 * auVar131._4_4_;
          bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar131._8_4_ = bVar10 * uVar142 | !bVar10 * auVar131._8_4_;
          bVar10 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar131._12_4_ = bVar10 * uVar143 | !bVar10 * auVar131._12_4_;
          bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar131._16_4_ = bVar10 * uVar144 | !bVar10 * auVar131._16_4_;
          bVar10 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar131._20_4_ = bVar10 * uVar145 | !bVar10 * auVar131._20_4_;
          bVar10 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar131._24_4_ = bVar10 * uVar146 | !bVar10 * auVar131._24_4_;
          bVar10 = SUB81(uVar78 >> 7,0);
          auVar131._28_4_ = bVar10 * uVar147 | !bVar10 * auVar131._28_4_;
          auVar96 = vblendmps_avx512vl(auVar259,auVar267);
          bVar10 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar74 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar74 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar74 >> 6) & 1);
          bVar16 = SUB81(uVar74 >> 7,0);
          auVar132._0_4_ =
               (uint)(bVar69 & 1) *
               ((uint)(bVar68 & 1) * auVar96._0_4_ | !(bool)(bVar68 & 1) * uVar79) |
               !(bool)(bVar69 & 1) * auVar132._0_4_;
          bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar132._4_4_ =
               (uint)bVar76 * ((uint)bVar10 * auVar96._4_4_ | !bVar10 * uVar141) |
               !bVar76 * auVar132._4_4_;
          bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar132._8_4_ =
               (uint)bVar10 * ((uint)bVar11 * auVar96._8_4_ | !bVar11 * uVar142) |
               !bVar10 * auVar132._8_4_;
          bVar10 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar132._12_4_ =
               (uint)bVar10 * ((uint)bVar12 * auVar96._12_4_ | !bVar12 * uVar143) |
               !bVar10 * auVar132._12_4_;
          bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar132._16_4_ =
               (uint)bVar10 * ((uint)bVar13 * auVar96._16_4_ | !bVar13 * uVar144) |
               !bVar10 * auVar132._16_4_;
          bVar10 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar132._20_4_ =
               (uint)bVar10 * ((uint)bVar14 * auVar96._20_4_ | !bVar14 * uVar145) |
               !bVar10 * auVar132._20_4_;
          bVar10 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar132._24_4_ =
               (uint)bVar10 * ((uint)bVar15 * auVar96._24_4_ | !bVar15 * uVar146) |
               !bVar10 * auVar132._24_4_;
          bVar10 = SUB81(uVar78 >> 7,0);
          auVar132._28_4_ =
               (uint)bVar10 * ((uint)bVar16 * auVar96._28_4_ | !bVar16 * uVar147) |
               !bVar10 * auVar132._28_4_;
          bVar73 = (~bVar69 | bVar68) & bVar73;
        }
      }
      auVar266._8_4_ = 0x7fffffff;
      auVar266._0_8_ = 0x7fffffff7fffffff;
      auVar266._12_4_ = 0x7fffffff;
      auVar271 = ZEXT3264(local_8a0);
      auVar270 = ZEXT3264(local_880);
      auVar95 = vmulps_avx512vl(local_800,auVar95);
      auVar94 = vfmadd231ps_avx512vl(auVar95,local_8a0,auVar94);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_880,auVar100);
      _local_1c0 = _local_660;
      local_1a0 = vminps_avx(local_440,auVar131);
      auVar221 = ZEXT3264(local_1a0);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(auVar94,auVar247);
      auVar231 = ZEXT3264(auVar94);
      _local_460 = vmaxps_avx(_local_660,auVar132);
      auVar212._8_4_ = 0x3e99999a;
      auVar212._0_8_ = 0x3e99999a3e99999a;
      auVar212._12_4_ = 0x3e99999a;
      auVar212._16_4_ = 0x3e99999a;
      auVar212._20_4_ = 0x3e99999a;
      auVar212._24_4_ = 0x3e99999a;
      auVar212._28_4_ = 0x3e99999a;
      uVar25 = vcmpps_avx512vl(auVar94,auVar212,1);
      local_8ac = (undefined4)uVar25;
      uVar25 = vcmpps_avx512vl(_local_660,local_1a0,2);
      bVar69 = (byte)uVar25 & bVar71;
      _local_540 = _local_460;
      uVar26 = vcmpps_avx512vl(_local_460,local_440,2);
      if ((bVar71 & ((byte)uVar26 | (byte)uVar25)) == 0) {
        auVar262 = ZEXT3264(auVar247);
        auVar263 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar94 = vmulps_avx512vl(local_800,auVar101);
        auVar94 = vfmadd213ps_avx512vl(auVar106,local_8a0,auVar94);
        auVar94 = vfmadd213ps_avx512vl(auVar102,local_880,auVar94);
        auVar94 = vandps_avx(auVar94,auVar247);
        uVar25 = vcmpps_avx512vl(auVar94,auVar212,1);
        local_8b4 = (uint)(byte)~bVar73;
        bVar73 = (byte)uVar25 | ~bVar73;
        auVar167._8_4_ = 2;
        auVar167._0_8_ = 0x200000002;
        auVar167._12_4_ = 2;
        auVar167._16_4_ = 2;
        auVar167._20_4_ = 2;
        auVar167._24_4_ = 2;
        auVar167._28_4_ = 2;
        auVar44._8_4_ = 3;
        auVar44._0_8_ = 0x300000003;
        auVar44._12_4_ = 3;
        auVar44._16_4_ = 3;
        auVar44._20_4_ = 3;
        auVar44._24_4_ = 3;
        auVar44._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar167,auVar44);
        local_420._0_4_ = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
        bVar10 = (bool)(bVar73 >> 1 & 1);
        local_420._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar73 >> 2 & 1);
        local_420._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar73 >> 3 & 1);
        local_420._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar73 >> 4 & 1);
        local_420._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar73 >> 5 & 1);
        local_420._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar73 >> 6 & 1);
        local_420._24_4_ = (uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * 2;
        local_420._28_4_ = (uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
        local_4a0 = vpbroadcastd_avx512vl();
        uVar25 = vpcmpd_avx512vl(local_4a0,local_420,5);
        local_8b0 = (uint)bVar69;
        bVar69 = (byte)uVar25 & bVar69;
        if (bVar69 != 0) {
          auVar83 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar84 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar87 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar88 = vminps_avx(auVar83,auVar87);
          auVar83 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar87 = vmaxps_avx(auVar84,auVar83);
          auVar84 = vandps_avx(auVar266,auVar88);
          auVar83 = vandps_avx(auVar266,auVar87);
          auVar84 = vmaxps_avx(auVar84,auVar83);
          auVar83 = vmovshdup_avx(auVar84);
          auVar83 = vmaxss_avx(auVar83,auVar84);
          auVar84 = vshufpd_avx(auVar84,auVar84,1);
          auVar84 = vmaxss_avx(auVar84,auVar83);
          fVar240 = auVar84._0_4_ * 1.9073486e-06;
          local_750 = vshufps_avx(auVar87,auVar87,0xff);
          local_520 = (float)local_660._0_4_ + (float)local_780._0_4_;
          fStack_51c = (float)local_660._4_4_ + (float)local_780._4_4_;
          fStack_518 = fStack_658 + fStack_778;
          fStack_514 = fStack_654 + fStack_774;
          fStack_510 = fStack_650 + fStack_770;
          fStack_50c = fStack_64c + fStack_76c;
          fStack_508 = fStack_648 + fStack_768;
          fStack_504 = fStack_644 + fStack_764;
          do {
            auVar168._8_4_ = 0x7f800000;
            auVar168._0_8_ = 0x7f8000007f800000;
            auVar168._12_4_ = 0x7f800000;
            auVar168._16_4_ = 0x7f800000;
            auVar168._20_4_ = 0x7f800000;
            auVar168._24_4_ = 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar168,_local_660);
            auVar134._0_4_ =
                 (uint)(bVar69 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
            bVar10 = (bool)(bVar69 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar69 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar69 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar69 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar69 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar69 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar69 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar94 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar94 = vminps_avx(auVar134,auVar94);
            auVar95 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar95);
            auVar95 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar95);
            uVar25 = vcmpps_avx512vl(auVar134,auVar94,0);
            bVar68 = (byte)uVar25 & bVar69;
            bVar73 = bVar69;
            if (bVar68 != 0) {
              bVar73 = bVar68;
            }
            iVar28 = 0;
            for (uVar79 = (uint)bVar73; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar28 = iVar28 + 1;
            }
            fVar248 = *(float *)(local_4e0 + (uint)(iVar28 << 2));
            fVar249 = *(float *)(local_1c0 + (uint)(iVar28 << 2));
            fVar251 = local_8a8;
            if ((float)local_7a0._0_4_ < 0.0) {
              fVar251 = sqrtf((float)local_7a0._0_4_);
            }
            lVar75 = 4;
            do {
              auVar153._4_4_ = fVar249;
              auVar153._0_4_ = fVar249;
              auVar153._8_4_ = fVar249;
              auVar153._12_4_ = fVar249;
              auVar83 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_790);
              fVar264 = 1.0 - fVar248;
              auVar198._0_4_ = local_6c0._0_4_ * fVar248;
              auVar198._4_4_ = local_6c0._4_4_ * fVar248;
              auVar198._8_4_ = local_6c0._8_4_ * fVar248;
              auVar198._12_4_ = local_6c0._12_4_ * fVar248;
              local_6f0 = ZEXT416((uint)fVar264);
              auVar218._4_4_ = fVar264;
              auVar218._0_4_ = fVar264;
              auVar218._8_4_ = fVar264;
              auVar218._12_4_ = fVar264;
              auVar84 = vfmadd231ps_fma(auVar198,auVar218,local_680._0_16_);
              auVar225._0_4_ = local_6a0._0_4_ * fVar248;
              auVar225._4_4_ = local_6a0._4_4_ * fVar248;
              auVar225._8_4_ = local_6a0._8_4_ * fVar248;
              auVar225._12_4_ = local_6a0._12_4_ * fVar248;
              auVar87 = vfmadd231ps_fma(auVar225,auVar218,local_6c0._0_16_);
              auVar237._0_4_ = fVar248 * (float)local_6e0._0_4_;
              auVar237._4_4_ = fVar248 * (float)local_6e0._4_4_;
              auVar237._8_4_ = fVar248 * fStack_6d8;
              auVar237._12_4_ = fVar248 * fStack_6d4;
              auVar88 = vfmadd231ps_fma(auVar237,auVar218,local_6a0._0_16_);
              auVar245._0_4_ = fVar248 * auVar87._0_4_;
              auVar245._4_4_ = fVar248 * auVar87._4_4_;
              auVar245._8_4_ = fVar248 * auVar87._8_4_;
              auVar245._12_4_ = fVar248 * auVar87._12_4_;
              auVar84 = vfmadd231ps_fma(auVar245,auVar218,auVar84);
              auVar199._0_4_ = fVar248 * auVar88._0_4_;
              auVar199._4_4_ = fVar248 * auVar88._4_4_;
              auVar199._8_4_ = fVar248 * auVar88._8_4_;
              auVar199._12_4_ = fVar248 * auVar88._12_4_;
              auVar87 = vfmadd231ps_fma(auVar199,auVar218,auVar87);
              auVar226._0_4_ = fVar248 * auVar87._0_4_;
              auVar226._4_4_ = fVar248 * auVar87._4_4_;
              auVar226._8_4_ = fVar248 * auVar87._8_4_;
              auVar226._12_4_ = fVar248 * auVar87._12_4_;
              auVar88 = vfmadd231ps_fma(auVar226,auVar84,auVar218);
              auVar84 = vsubps_avx(auVar87,auVar84);
              auVar35._8_4_ = 0x40400000;
              auVar35._0_8_ = 0x4040000040400000;
              auVar35._12_4_ = 0x40400000;
              auVar87 = vmulps_avx512vl(auVar84,auVar35);
              local_640._0_16_ = auVar88;
              auVar84 = vsubps_avx(auVar83,auVar88);
              local_7c0._0_16_ = auVar84;
              auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
              local_7e0._0_16_ = auVar84;
              local_920 = ZEXT416((uint)fVar248);
              if (auVar84._0_4_ < 0.0) {
                auVar221._0_4_ = sqrtf(auVar84._0_4_);
                auVar221._4_60_ = extraout_var;
                auVar84 = auVar221._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
              }
              local_700 = vdpps_avx(auVar87,auVar87,0x7f);
              fVar264 = local_700._0_4_;
              auVar200._4_12_ = ZEXT812(0) << 0x20;
              auVar200._0_4_ = fVar264;
              auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar200);
              fVar173 = auVar83._0_4_;
              local_710 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar200);
              auVar36._8_4_ = 0x80000000;
              auVar36._0_8_ = 0x8000000080000000;
              auVar36._12_4_ = 0x80000000;
              auVar88 = vxorps_avx512vl(local_700,auVar36);
              auVar83 = vfnmadd213ss_fma(local_710,local_700,ZEXT416(0x40000000));
              uVar79 = auVar84._0_4_;
              if (fVar264 < auVar88._0_4_) {
                auVar231._0_4_ = sqrtf(fVar264);
                auVar231._4_60_ = extraout_var_00;
                auVar84 = ZEXT416(uVar79);
                auVar88 = auVar231._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx512f(local_700,local_700);
              }
              fVar264 = fVar173 * 1.5 + fVar264 * -0.5 * fVar173 * fVar173 * fVar173;
              auVar154._0_4_ = auVar87._0_4_ * fVar264;
              auVar154._4_4_ = auVar87._4_4_ * fVar264;
              auVar154._8_4_ = auVar87._8_4_ * fVar264;
              auVar154._12_4_ = auVar87._12_4_ * fVar264;
              auVar24 = vdpps_avx(local_7c0._0_16_,auVar154,0x7f);
              fVar254 = auVar84._0_4_;
              fVar173 = auVar24._0_4_;
              auVar155._0_4_ = fVar173 * fVar173;
              auVar155._4_4_ = auVar24._4_4_ * auVar24._4_4_;
              auVar155._8_4_ = auVar24._8_4_ * auVar24._8_4_;
              auVar155._12_4_ = auVar24._12_4_ * auVar24._12_4_;
              auVar89 = vsubps_avx512vl(local_7e0._0_16_,auVar155);
              fVar253 = auVar89._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar253;
              auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar85 = vmulss_avx512f(auVar90,ZEXT416(0x3fc00000));
              auVar91 = vmulss_avx512f(auVar89,ZEXT416(0xbf000000));
              if (fVar253 < 0.0) {
                local_730 = fVar264;
                fStack_72c = fVar264;
                fStack_728 = fVar264;
                fStack_724 = fVar264;
                local_720 = auVar90;
                fVar253 = sqrtf(fVar253);
                auVar91 = ZEXT416(auVar91._0_4_);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar84 = ZEXT416(uVar79);
                auVar90 = local_720;
                fVar264 = local_730;
                fVar255 = fStack_72c;
                fVar250 = fStack_728;
                fVar252 = fStack_724;
              }
              else {
                auVar89 = vsqrtss_avx(auVar89,auVar89);
                fVar253 = auVar89._0_4_;
                fVar255 = fVar264;
                fVar250 = fVar264;
                fVar252 = fVar264;
              }
              auVar266._8_4_ = 0x7fffffff;
              auVar266._0_8_ = 0x7fffffff7fffffff;
              auVar266._12_4_ = 0x7fffffff;
              auVar270 = ZEXT3264(local_880);
              auVar271 = ZEXT3264(local_8a0);
              auVar269 = ZEXT3264(local_800);
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_6f0);
              fVar172 = auVar89._0_4_ * 6.0;
              fVar23 = fVar248 * 6.0;
              auVar201._0_4_ = fVar23 * (float)local_6e0._0_4_;
              auVar201._4_4_ = fVar23 * (float)local_6e0._4_4_;
              auVar201._8_4_ = fVar23 * fStack_6d8;
              auVar201._12_4_ = fVar23 * fStack_6d4;
              auVar178._4_4_ = fVar172;
              auVar178._0_4_ = fVar172;
              auVar178._8_4_ = fVar172;
              auVar178._12_4_ = fVar172;
              auVar89 = vfmadd132ps_fma(auVar178,auVar201,local_6a0._0_16_);
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_6f0,local_920);
              fVar172 = auVar86._0_4_ * 6.0;
              auVar202._4_4_ = fVar172;
              auVar202._0_4_ = fVar172;
              auVar202._8_4_ = fVar172;
              auVar202._12_4_ = fVar172;
              auVar89 = vfmadd132ps_fma(auVar202,auVar89,local_6c0._0_16_);
              fVar172 = local_6f0._0_4_ * 6.0;
              auVar179._4_4_ = fVar172;
              auVar179._0_4_ = fVar172;
              auVar179._8_4_ = fVar172;
              auVar179._12_4_ = fVar172;
              auVar89 = vfmadd132ps_fma(auVar179,auVar89,local_680._0_16_);
              auVar203._0_4_ = auVar89._0_4_ * (float)local_700._0_4_;
              auVar203._4_4_ = auVar89._4_4_ * (float)local_700._0_4_;
              auVar203._8_4_ = auVar89._8_4_ * (float)local_700._0_4_;
              auVar203._12_4_ = auVar89._12_4_ * (float)local_700._0_4_;
              auVar89 = vdpps_avx(auVar87,auVar89,0x7f);
              fVar172 = auVar89._0_4_;
              auVar180._0_4_ = auVar87._0_4_ * fVar172;
              auVar180._4_4_ = auVar87._4_4_ * fVar172;
              auVar180._8_4_ = auVar87._8_4_ * fVar172;
              auVar180._12_4_ = auVar87._12_4_ * fVar172;
              auVar89 = vsubps_avx(auVar203,auVar180);
              fVar172 = auVar83._0_4_ * (float)local_710._0_4_;
              auVar37._8_4_ = 0x80000000;
              auVar37._0_8_ = 0x8000000080000000;
              auVar37._12_4_ = 0x80000000;
              auVar136._16_16_ = local_800._16_16_;
              auVar92 = vxorps_avx512vl(auVar87,auVar37);
              auVar227._0_4_ = fVar264 * auVar89._0_4_ * fVar172;
              auVar227._4_4_ = fVar255 * auVar89._4_4_ * fVar172;
              auVar227._8_4_ = fVar250 * auVar89._8_4_ * fVar172;
              auVar227._12_4_ = fVar252 * auVar89._12_4_ * fVar172;
              auVar83 = vdpps_avx(auVar92,auVar154,0x7f);
              auVar89 = vmaxss_avx(ZEXT416((uint)fVar240),
                                   ZEXT416((uint)(fVar249 * fVar251 * 1.9073486e-06)));
              auVar86 = vdivss_avx512f(ZEXT416((uint)fVar240),auVar88);
              auVar88 = vdpps_avx(local_7c0._0_16_,auVar227,0x7f);
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar240),auVar89);
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar254 + 1.0)),auVar86,auVar84);
              auVar84 = vdpps_avx(local_790,auVar154,0x7f);
              fVar264 = auVar83._0_4_ + auVar88._0_4_;
              auVar83 = vdpps_avx(local_7c0._0_16_,auVar92,0x7f);
              auVar91 = vmulss_avx512f(auVar91,auVar90);
              auVar90 = vmulss_avx512f(auVar90,auVar90);
              auVar88 = vdpps_avx(local_7c0._0_16_,local_790,0x7f);
              auVar91 = vaddss_avx512f(auVar85,ZEXT416((uint)(auVar91._0_4_ * auVar90._0_4_)));
              auVar90 = vfnmadd231ss_fma(auVar83,auVar24,ZEXT416((uint)fVar264));
              auVar85 = vfnmadd231ss_fma(auVar88,auVar24,auVar84);
              auVar83 = vpermilps_avx(local_640._0_16_,0xff);
              fVar253 = fVar253 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar87,auVar87,0xff);
              auVar88 = vfmsub213ss_fma(auVar90,auVar91,auVar83);
              fVar254 = auVar85._0_4_ * auVar91._0_4_;
              auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar264),ZEXT416((uint)fVar254));
              fVar255 = auVar90._0_4_;
              fVar264 = fVar253 * (fVar264 / fVar255) - fVar173 * (auVar88._0_4_ / fVar255);
              auVar231 = ZEXT464((uint)fVar264);
              fVar248 = fVar248 - (fVar173 * (fVar254 / fVar255) -
                                  fVar253 * (auVar84._0_4_ / fVar255));
              fVar249 = fVar249 - fVar264;
              auVar84 = vandps_avx(auVar24,auVar266);
              if (auVar86._0_4_ <= auVar84._0_4_) {
LAB_01c6e23b:
                bVar10 = false;
              }
              else {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar89._0_4_)),local_750,
                                          ZEXT416(0x36000000));
                auVar84 = vandps_avx(auVar266,ZEXT416((uint)fVar253));
                if (auVar88._0_4_ <= auVar84._0_4_) goto LAB_01c6e23b;
                fVar249 = fVar249 + (float)local_740._0_4_;
                bVar10 = true;
                if (fVar148 <= fVar249) {
                  fVar264 = *(float *)(ray + k * 4 + 0x80);
                  auVar231 = ZEXT464((uint)fVar264);
                  if (((fVar249 <= fVar264) && (0.0 <= fVar248)) && (fVar248 <= 1.0)) {
                    auVar136._0_16_ = ZEXT816(0) << 0x20;
                    auVar135._4_28_ = auVar136._4_28_;
                    auVar135._0_4_ = local_7e0._0_4_;
                    auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar135._0_16_);
                    fVar173 = auVar84._0_4_;
                    auVar84 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar70].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
LAB_01c6e4e1:
                      auVar231 = ZEXT464((uint)fVar264);
                    }
                    else {
                      fVar173 = fVar173 * 1.5 + auVar84._0_4_ * fVar173 * fVar173 * fVar173;
                      auVar181._0_4_ = local_7c0._0_4_ * fVar173;
                      auVar181._4_4_ = local_7c0._4_4_ * fVar173;
                      auVar181._8_4_ = local_7c0._8_4_ * fVar173;
                      auVar181._12_4_ = local_7c0._12_4_ * fVar173;
                      auVar88 = vfmadd213ps_fma(auVar83,auVar181,auVar87);
                      auVar84 = vshufps_avx(auVar181,auVar181,0xc9);
                      auVar83 = vshufps_avx(auVar87,auVar87,0xc9);
                      auVar182._0_4_ = auVar181._0_4_ * auVar83._0_4_;
                      auVar182._4_4_ = auVar181._4_4_ * auVar83._4_4_;
                      auVar182._8_4_ = auVar181._8_4_ * auVar83._8_4_;
                      auVar182._12_4_ = auVar181._12_4_ * auVar83._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar182,auVar87,auVar84);
                      auVar84 = vshufps_avx(auVar87,auVar87,0xc9);
                      auVar83 = vshufps_avx(auVar88,auVar88,0xc9);
                      auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                      auVar156._0_4_ = auVar88._0_4_ * auVar87._0_4_;
                      auVar156._4_4_ = auVar88._4_4_ * auVar87._4_4_;
                      auVar156._8_4_ = auVar88._8_4_ * auVar87._8_4_;
                      auVar156._12_4_ = auVar88._12_4_ * auVar87._12_4_;
                      auVar84 = vfmsub231ps_fma(auVar156,auVar84,auVar83);
                      uVar265 = auVar84._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar249;
                        uVar3 = vextractps_avx(auVar84,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                        uVar3 = vextractps_avx(auVar84,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar265;
                        *(float *)(ray + k * 4 + 0xf0) = fVar248;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_808;
                        *(uint *)(ray + k * 4 + 0x120) = uVar70;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_5e0 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                        auStack_5d0 = vshufps_avx(auVar84,auVar84,0xaa);
                        local_5c0 = uVar265;
                        uStack_5bc = uVar265;
                        uStack_5b8 = uVar265;
                        uStack_5b4 = uVar265;
                        local_5b0 = fVar248;
                        fStack_5ac = fVar248;
                        fStack_5a8 = fVar248;
                        fStack_5a4 = fVar248;
                        local_5a0 = ZEXT416(0) << 0x20;
                        local_590 = local_600._0_8_;
                        uStack_588 = local_600._8_8_;
                        local_580 = local_5f0;
                        vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                        uStack_56c = context->user->instID[0];
                        local_570 = uStack_56c;
                        uStack_568 = uStack_56c;
                        uStack_564 = uStack_56c;
                        uStack_560 = context->user->instPrimID[0];
                        uStack_55c = uStack_560;
                        uStack_558 = uStack_560;
                        uStack_554 = uStack_560;
                        *(float *)(ray + k * 4 + 0x80) = fVar249;
                        local_8e0 = local_610._0_8_;
                        uStack_8d8 = local_610._8_8_;
                        local_860.valid = (int *)&local_8e0;
                        local_860.geometryUserPtr = pGVar4->userPtr;
                        local_860.context = context->user;
                        local_860.hit = local_5e0;
                        local_860.N = 4;
                        local_860.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_860);
                          auVar269 = ZEXT3264(local_800);
                          auVar271 = ZEXT3264(local_8a0);
                          auVar270 = ZEXT3264(local_880);
                          auVar266._8_4_ = 0x7fffffff;
                          auVar266._0_8_ = 0x7fffffff7fffffff;
                          auVar266._12_4_ = 0x7fffffff;
                        }
                        auVar61._8_8_ = uStack_8d8;
                        auVar61._0_8_ = local_8e0;
                        uVar77 = vptestmd_avx512vl(auVar61,auVar61);
                        if ((uVar77 & 0xf) != 0) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_860);
                            auVar269 = ZEXT3264(local_800);
                            auVar271 = ZEXT3264(local_8a0);
                            auVar270 = ZEXT3264(local_880);
                            auVar266._8_4_ = 0x7fffffff;
                            auVar266._0_8_ = 0x7fffffff7fffffff;
                            auVar266._12_4_ = 0x7fffffff;
                          }
                          auVar62._8_8_ = uStack_8d8;
                          auVar62._0_8_ = local_8e0;
                          uVar77 = vptestmd_avx512vl(auVar62,auVar62);
                          uVar77 = uVar77 & 0xf;
                          bVar73 = (byte)uVar77;
                          if (bVar73 != 0) {
                            iVar58 = *(int *)(local_860.hit + 4);
                            iVar59 = *(int *)(local_860.hit + 8);
                            iVar60 = *(int *)(local_860.hit + 0xc);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar12 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_860.ray + 0xc0) =
                                 (uint)(bVar73 & 1) * *(int *)local_860.hit |
                                 (uint)!(bool)(bVar73 & 1) * *(int *)(local_860.ray + 0xc0);
                            *(uint *)(local_860.ray + 0xc4) =
                                 (uint)bVar76 * iVar58 |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0xc4);
                            *(uint *)(local_860.ray + 200) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_860.ray + 200);
                            *(uint *)(local_860.ray + 0xcc) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_860.ray + 0xcc);
                            iVar58 = *(int *)(local_860.hit + 0x14);
                            iVar59 = *(int *)(local_860.hit + 0x18);
                            iVar60 = *(int *)(local_860.hit + 0x1c);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar12 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_860.ray + 0xd0) =
                                 (uint)(bVar73 & 1) * *(int *)(local_860.hit + 0x10) |
                                 (uint)!(bool)(bVar73 & 1) * *(int *)(local_860.ray + 0xd0);
                            *(uint *)(local_860.ray + 0xd4) =
                                 (uint)bVar76 * iVar58 |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0xd4);
                            *(uint *)(local_860.ray + 0xd8) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_860.ray + 0xd8);
                            *(uint *)(local_860.ray + 0xdc) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_860.ray + 0xdc);
                            iVar58 = *(int *)(local_860.hit + 0x24);
                            iVar59 = *(int *)(local_860.hit + 0x28);
                            iVar60 = *(int *)(local_860.hit + 0x2c);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar12 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_860.ray + 0xe0) =
                                 (uint)(bVar73 & 1) * *(int *)(local_860.hit + 0x20) |
                                 (uint)!(bool)(bVar73 & 1) * *(int *)(local_860.ray + 0xe0);
                            *(uint *)(local_860.ray + 0xe4) =
                                 (uint)bVar76 * iVar58 |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0xe4);
                            *(uint *)(local_860.ray + 0xe8) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_860.ray + 0xe8);
                            *(uint *)(local_860.ray + 0xec) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_860.ray + 0xec);
                            iVar58 = *(int *)(local_860.hit + 0x34);
                            iVar59 = *(int *)(local_860.hit + 0x38);
                            iVar60 = *(int *)(local_860.hit + 0x3c);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar12 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_860.ray + 0xf0) =
                                 (uint)(bVar73 & 1) * *(int *)(local_860.hit + 0x30) |
                                 (uint)!(bool)(bVar73 & 1) * *(int *)(local_860.ray + 0xf0);
                            *(uint *)(local_860.ray + 0xf4) =
                                 (uint)bVar76 * iVar58 |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0xf4);
                            *(uint *)(local_860.ray + 0xf8) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_860.ray + 0xf8);
                            *(uint *)(local_860.ray + 0xfc) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_860.ray + 0xfc);
                            iVar58 = *(int *)(local_860.hit + 0x44);
                            iVar59 = *(int *)(local_860.hit + 0x48);
                            iVar60 = *(int *)(local_860.hit + 0x4c);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar12 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_860.ray + 0x100) =
                                 (uint)(bVar73 & 1) * *(int *)(local_860.hit + 0x40) |
                                 (uint)!(bool)(bVar73 & 1) * *(int *)(local_860.ray + 0x100);
                            *(uint *)(local_860.ray + 0x104) =
                                 (uint)bVar76 * iVar58 |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0x104);
                            *(uint *)(local_860.ray + 0x108) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_860.ray + 0x108);
                            *(uint *)(local_860.ray + 0x10c) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_860.ray + 0x10c);
                            auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x50));
                            *(undefined1 (*) [16])(local_860.ray + 0x110) = auVar84;
                            auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x60));
                            *(undefined1 (*) [16])(local_860.ray + 0x120) = auVar84;
                            auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x70));
                            *(undefined1 (*) [16])(local_860.ray + 0x130) = auVar84;
                            auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x80));
                            *(undefined1 (*) [16])(local_860.ray + 0x140) = auVar84;
                            goto LAB_01c6e4e1;
                          }
                        }
                        auVar231 = ZEXT464((uint)fVar264);
                        *(float *)(ray + k * 4 + 0x80) = fVar264;
                      }
                    }
                  }
                }
              }
              bVar76 = lVar75 != 0;
              lVar75 = lVar75 + -1;
            } while ((!bVar10) && (bVar76));
            auVar65._4_4_ = fStack_51c;
            auVar65._0_4_ = local_520;
            auVar65._8_4_ = fStack_518;
            auVar65._12_4_ = fStack_514;
            auVar65._16_4_ = fStack_510;
            auVar65._20_4_ = fStack_50c;
            auVar65._24_4_ = fStack_508;
            auVar65._28_4_ = fStack_504;
            uVar265 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar45._4_4_ = uVar265;
            auVar45._0_4_ = uVar265;
            auVar45._8_4_ = uVar265;
            auVar45._12_4_ = uVar265;
            auVar45._16_4_ = uVar265;
            auVar45._20_4_ = uVar265;
            auVar45._24_4_ = uVar265;
            auVar45._28_4_ = uVar265;
            uVar25 = vcmpps_avx512vl(auVar65,auVar45,2);
            bVar69 = ~('\x01' << ((byte)iVar28 & 0x1f)) & bVar69 & (byte)uVar25;
          } while (bVar69 != 0);
        }
        auVar169._0_4_ = (float)local_540._0_4_ + (float)local_780._0_4_;
        auVar169._4_4_ = (float)local_540._4_4_ + (float)local_780._4_4_;
        auVar169._8_4_ = fStack_538 + fStack_778;
        auVar169._12_4_ = fStack_534 + fStack_774;
        auVar169._16_4_ = fStack_530 + fStack_770;
        auVar169._20_4_ = fStack_52c + fStack_76c;
        auVar169._24_4_ = fStack_528 + fStack_768;
        auVar169._28_4_ = fStack_524 + fStack_764;
        uVar265 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar46._4_4_ = uVar265;
        auVar46._0_4_ = uVar265;
        auVar46._8_4_ = uVar265;
        auVar46._12_4_ = uVar265;
        auVar46._16_4_ = uVar265;
        auVar46._20_4_ = uVar265;
        auVar46._24_4_ = uVar265;
        auVar46._28_4_ = uVar265;
        uVar25 = vcmpps_avx512vl(auVar169,auVar46,2);
        bVar73 = (byte)local_8ac | (byte)local_8b4;
        bVar71 = (byte)uVar26 & bVar71 & (byte)uVar25;
        auVar170._8_4_ = 2;
        auVar170._0_8_ = 0x200000002;
        auVar170._12_4_ = 2;
        auVar170._16_4_ = 2;
        auVar170._20_4_ = 2;
        auVar170._24_4_ = 2;
        auVar170._28_4_ = 2;
        auVar47._8_4_ = 3;
        auVar47._0_8_ = 0x300000003;
        auVar47._12_4_ = 3;
        auVar47._16_4_ = 3;
        auVar47._20_4_ = 3;
        auVar47._24_4_ = 3;
        auVar47._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar170,auVar47);
        local_540._0_4_ = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
        bVar10 = (bool)(bVar73 >> 1 & 1);
        local_540._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 2;
        bVar10 = (bool)(bVar73 >> 2 & 1);
        fStack_538 = (float)((uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 2);
        bVar10 = (bool)(bVar73 >> 3 & 1);
        fStack_534 = (float)((uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 2);
        bVar10 = (bool)(bVar73 >> 4 & 1);
        fStack_530 = (float)((uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 2);
        bVar10 = (bool)(bVar73 >> 5 & 1);
        fStack_52c = (float)((uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 2);
        bVar10 = (bool)(bVar73 >> 6 & 1);
        fStack_528 = (float)((uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * 2);
        fStack_524 = (float)((uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2);
        uVar25 = vpcmpd_avx512vl(_local_540,local_4a0,2);
        bVar73 = (byte)uVar25 & bVar71;
        if (bVar73 != 0) {
          auVar83 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar84 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar87 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar88 = vminps_avx(auVar83,auVar87);
          auVar83 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar87 = vmaxps_avx(auVar84,auVar83);
          auVar84 = vandps_avx(auVar266,auVar88);
          auVar83 = vandps_avx(auVar266,auVar87);
          auVar84 = vmaxps_avx(auVar84,auVar83);
          auVar83 = vmovshdup_avx(auVar84);
          auVar83 = vmaxss_avx(auVar83,auVar84);
          auVar84 = vshufpd_avx(auVar84,auVar84,1);
          auVar84 = vmaxss_avx(auVar84,auVar83);
          fVar240 = auVar84._0_4_ * 1.9073486e-06;
          local_750 = vshufps_avx(auVar87,auVar87,0xff);
          _local_660 = _local_460;
          local_520 = (float)local_460._0_4_ + (float)local_780._0_4_;
          fStack_51c = (float)local_460._4_4_ + (float)local_780._4_4_;
          fStack_518 = fStack_458 + fStack_778;
          fStack_514 = fStack_454 + fStack_774;
          fStack_510 = fStack_450 + fStack_770;
          fStack_50c = fStack_44c + fStack_76c;
          fStack_508 = fStack_448 + fStack_768;
          fStack_504 = fStack_444 + fStack_764;
          do {
            auVar171._8_4_ = 0x7f800000;
            auVar171._0_8_ = 0x7f8000007f800000;
            auVar171._12_4_ = 0x7f800000;
            auVar171._16_4_ = 0x7f800000;
            auVar171._20_4_ = 0x7f800000;
            auVar171._24_4_ = 0x7f800000;
            auVar171._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar171,_local_660);
            auVar137._0_4_ =
                 (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
            bVar10 = (bool)(bVar73 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar73 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar73 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar73 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 0x7f800000;
            bVar10 = (bool)(bVar73 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 0x7f800000;
            auVar137._24_4_ =
                 (uint)(bVar73 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar73 >> 6) * 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar94 = vshufps_avx(auVar137,auVar137,0xb1);
            auVar94 = vminps_avx(auVar137,auVar94);
            auVar95 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar95);
            auVar95 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar95);
            uVar25 = vcmpps_avx512vl(auVar137,auVar94,0);
            bVar68 = (byte)uVar25 & bVar73;
            bVar69 = bVar73;
            if (bVar68 != 0) {
              bVar69 = bVar68;
            }
            iVar28 = 0;
            for (uVar79 = (uint)bVar69; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar28 = iVar28 + 1;
            }
            fVar248 = *(float *)(local_500 + (uint)(iVar28 << 2));
            fVar249 = *(float *)(local_440 + (uint)(iVar28 << 2));
            fVar251 = local_8a4;
            if ((float)local_7a0._0_4_ < 0.0) {
              fVar251 = sqrtf((float)local_7a0._0_4_);
            }
            lVar75 = 4;
            do {
              auVar157._4_4_ = fVar249;
              auVar157._0_4_ = fVar249;
              auVar157._8_4_ = fVar249;
              auVar157._12_4_ = fVar249;
              auVar83 = vfmadd132ps_fma(auVar157,ZEXT816(0) << 0x40,local_790);
              fVar264 = 1.0 - fVar248;
              auVar204._0_4_ = local_6c0._0_4_ * fVar248;
              auVar204._4_4_ = local_6c0._4_4_ * fVar248;
              auVar204._8_4_ = local_6c0._8_4_ * fVar248;
              auVar204._12_4_ = local_6c0._12_4_ * fVar248;
              local_6f0 = ZEXT416((uint)fVar264);
              auVar219._4_4_ = fVar264;
              auVar219._0_4_ = fVar264;
              auVar219._8_4_ = fVar264;
              auVar219._12_4_ = fVar264;
              auVar84 = vfmadd231ps_fma(auVar204,auVar219,local_680._0_16_);
              auVar228._0_4_ = local_6a0._0_4_ * fVar248;
              auVar228._4_4_ = local_6a0._4_4_ * fVar248;
              auVar228._8_4_ = local_6a0._8_4_ * fVar248;
              auVar228._12_4_ = local_6a0._12_4_ * fVar248;
              auVar87 = vfmadd231ps_fma(auVar228,auVar219,local_6c0._0_16_);
              auVar238._0_4_ = fVar248 * (float)local_6e0._0_4_;
              auVar238._4_4_ = fVar248 * (float)local_6e0._4_4_;
              auVar238._8_4_ = fVar248 * fStack_6d8;
              auVar238._12_4_ = fVar248 * fStack_6d4;
              auVar88 = vfmadd231ps_fma(auVar238,auVar219,local_6a0._0_16_);
              auVar246._0_4_ = fVar248 * auVar87._0_4_;
              auVar246._4_4_ = fVar248 * auVar87._4_4_;
              auVar246._8_4_ = fVar248 * auVar87._8_4_;
              auVar246._12_4_ = fVar248 * auVar87._12_4_;
              auVar84 = vfmadd231ps_fma(auVar246,auVar219,auVar84);
              auVar205._0_4_ = fVar248 * auVar88._0_4_;
              auVar205._4_4_ = fVar248 * auVar88._4_4_;
              auVar205._8_4_ = fVar248 * auVar88._8_4_;
              auVar205._12_4_ = fVar248 * auVar88._12_4_;
              auVar87 = vfmadd231ps_fma(auVar205,auVar219,auVar87);
              auVar229._0_4_ = fVar248 * auVar87._0_4_;
              auVar229._4_4_ = fVar248 * auVar87._4_4_;
              auVar229._8_4_ = fVar248 * auVar87._8_4_;
              auVar229._12_4_ = fVar248 * auVar87._12_4_;
              auVar88 = vfmadd231ps_fma(auVar229,auVar84,auVar219);
              auVar84 = vsubps_avx(auVar87,auVar84);
              auVar38._8_4_ = 0x40400000;
              auVar38._0_8_ = 0x4040000040400000;
              auVar38._12_4_ = 0x40400000;
              auVar87 = vmulps_avx512vl(auVar84,auVar38);
              local_640._0_16_ = auVar88;
              auVar84 = vsubps_avx(auVar83,auVar88);
              local_7c0._0_16_ = auVar84;
              auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
              local_7e0._0_16_ = auVar84;
              local_920 = ZEXT416((uint)fVar248);
              if (auVar84._0_4_ < 0.0) {
                auVar269._0_4_ = sqrtf(auVar84._0_4_);
                auVar269._4_60_ = extraout_var_01;
                auVar84 = auVar269._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
              }
              local_700 = vdpps_avx(auVar87,auVar87,0x7f);
              fVar264 = local_700._0_4_;
              auVar206._4_12_ = ZEXT812(0) << 0x20;
              auVar206._0_4_ = fVar264;
              auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar206);
              fVar173 = auVar83._0_4_;
              local_710 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar206);
              auVar39._8_4_ = 0x80000000;
              auVar39._0_8_ = 0x8000000080000000;
              auVar39._12_4_ = 0x80000000;
              auVar88 = vxorps_avx512vl(local_700,auVar39);
              auVar83 = vfnmadd213ss_fma(local_710,local_700,ZEXT416(0x40000000));
              uVar79 = auVar84._0_4_;
              if (fVar264 < auVar88._0_4_) {
                auVar270._0_4_ = sqrtf(fVar264);
                auVar270._4_60_ = extraout_var_02;
                auVar84 = ZEXT416(uVar79);
                auVar88 = auVar270._0_16_;
              }
              else {
                auVar88 = vsqrtss_avx512f(local_700,local_700);
              }
              fVar264 = fVar173 * 1.5 + fVar264 * -0.5 * fVar173 * fVar173 * fVar173;
              auVar158._0_4_ = auVar87._0_4_ * fVar264;
              auVar158._4_4_ = auVar87._4_4_ * fVar264;
              auVar158._8_4_ = auVar87._8_4_ * fVar264;
              auVar158._12_4_ = auVar87._12_4_ * fVar264;
              auVar24 = vdpps_avx(local_7c0._0_16_,auVar158,0x7f);
              fVar254 = auVar84._0_4_;
              fVar173 = auVar24._0_4_;
              auVar159._0_4_ = fVar173 * fVar173;
              auVar159._4_4_ = auVar24._4_4_ * auVar24._4_4_;
              auVar159._8_4_ = auVar24._8_4_ * auVar24._8_4_;
              auVar159._12_4_ = auVar24._12_4_ * auVar24._12_4_;
              auVar89 = vsubps_avx512vl(local_7e0._0_16_,auVar159);
              fVar253 = auVar89._0_4_;
              auVar183._4_12_ = ZEXT812(0) << 0x20;
              auVar183._0_4_ = fVar253;
              auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
              auVar85 = vmulss_avx512f(auVar90,ZEXT416(0x3fc00000));
              auVar91 = vmulss_avx512f(auVar89,ZEXT416(0xbf000000));
              if (fVar253 < 0.0) {
                local_730 = fVar264;
                fStack_72c = fVar264;
                fStack_728 = fVar264;
                fStack_724 = fVar264;
                local_720 = auVar90;
                fVar253 = sqrtf(fVar253);
                auVar91 = ZEXT416(auVar91._0_4_);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar84 = ZEXT416(uVar79);
                auVar90 = local_720;
                fVar264 = local_730;
                fVar255 = fStack_72c;
                fVar250 = fStack_728;
                fVar252 = fStack_724;
              }
              else {
                auVar89 = vsqrtss_avx(auVar89,auVar89);
                fVar253 = auVar89._0_4_;
                fVar255 = fVar264;
                fVar250 = fVar264;
                fVar252 = fVar264;
              }
              auVar261._8_4_ = 0x7fffffff;
              auVar261._0_8_ = 0x7fffffff7fffffff;
              auVar261._12_4_ = 0x7fffffff;
              auVar270 = ZEXT3264(local_880);
              auVar271 = ZEXT3264(local_8a0);
              auVar269 = ZEXT3264(local_800);
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_6f0);
              fVar172 = auVar89._0_4_ * 6.0;
              fVar23 = fVar248 * 6.0;
              auVar207._0_4_ = fVar23 * (float)local_6e0._0_4_;
              auVar207._4_4_ = fVar23 * (float)local_6e0._4_4_;
              auVar207._8_4_ = fVar23 * fStack_6d8;
              auVar207._12_4_ = fVar23 * fStack_6d4;
              auVar184._4_4_ = fVar172;
              auVar184._0_4_ = fVar172;
              auVar184._8_4_ = fVar172;
              auVar184._12_4_ = fVar172;
              auVar89 = vfmadd132ps_fma(auVar184,auVar207,local_6a0._0_16_);
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_6f0,local_920);
              fVar172 = auVar86._0_4_ * 6.0;
              auVar208._4_4_ = fVar172;
              auVar208._0_4_ = fVar172;
              auVar208._8_4_ = fVar172;
              auVar208._12_4_ = fVar172;
              auVar89 = vfmadd132ps_fma(auVar208,auVar89,local_6c0._0_16_);
              fVar172 = local_6f0._0_4_ * 6.0;
              auVar185._4_4_ = fVar172;
              auVar185._0_4_ = fVar172;
              auVar185._8_4_ = fVar172;
              auVar185._12_4_ = fVar172;
              auVar89 = vfmadd132ps_fma(auVar185,auVar89,local_680._0_16_);
              auVar209._0_4_ = auVar89._0_4_ * (float)local_700._0_4_;
              auVar209._4_4_ = auVar89._4_4_ * (float)local_700._0_4_;
              auVar209._8_4_ = auVar89._8_4_ * (float)local_700._0_4_;
              auVar209._12_4_ = auVar89._12_4_ * (float)local_700._0_4_;
              auVar89 = vdpps_avx(auVar87,auVar89,0x7f);
              fVar172 = auVar89._0_4_;
              auVar186._0_4_ = auVar87._0_4_ * fVar172;
              auVar186._4_4_ = auVar87._4_4_ * fVar172;
              auVar186._8_4_ = auVar87._8_4_ * fVar172;
              auVar186._12_4_ = auVar87._12_4_ * fVar172;
              auVar89 = vsubps_avx(auVar209,auVar186);
              fVar172 = auVar83._0_4_ * (float)local_710._0_4_;
              auVar40._8_4_ = 0x80000000;
              auVar40._0_8_ = 0x8000000080000000;
              auVar40._12_4_ = 0x80000000;
              auVar139._16_16_ = local_800._16_16_;
              auVar92 = vxorps_avx512vl(auVar87,auVar40);
              auVar230._0_4_ = fVar264 * auVar89._0_4_ * fVar172;
              auVar230._4_4_ = fVar255 * auVar89._4_4_ * fVar172;
              auVar230._8_4_ = fVar250 * auVar89._8_4_ * fVar172;
              auVar230._12_4_ = fVar252 * auVar89._12_4_ * fVar172;
              auVar83 = vdpps_avx(auVar92,auVar158,0x7f);
              auVar89 = vmaxss_avx(ZEXT416((uint)fVar240),
                                   ZEXT416((uint)(fVar249 * fVar251 * 1.9073486e-06)));
              auVar86 = vdivss_avx512f(ZEXT416((uint)fVar240),auVar88);
              auVar88 = vdpps_avx(local_7c0._0_16_,auVar230,0x7f);
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar240),auVar89);
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar254 + 1.0)),auVar86,auVar84);
              auVar84 = vdpps_avx(local_790,auVar158,0x7f);
              fVar264 = auVar83._0_4_ + auVar88._0_4_;
              auVar83 = vdpps_avx(local_7c0._0_16_,auVar92,0x7f);
              auVar91 = vmulss_avx512f(auVar91,auVar90);
              auVar90 = vmulss_avx512f(auVar90,auVar90);
              auVar88 = vdpps_avx(local_7c0._0_16_,local_790,0x7f);
              auVar91 = vaddss_avx512f(auVar85,ZEXT416((uint)(auVar91._0_4_ * auVar90._0_4_)));
              auVar90 = vfnmadd231ss_fma(auVar83,auVar24,ZEXT416((uint)fVar264));
              auVar85 = vfnmadd231ss_fma(auVar88,auVar24,auVar84);
              auVar83 = vpermilps_avx(local_640._0_16_,0xff);
              fVar253 = fVar253 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar87,auVar87,0xff);
              auVar88 = vfmsub213ss_fma(auVar90,auVar91,auVar83);
              fVar254 = auVar85._0_4_ * auVar91._0_4_;
              auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar88._0_4_)),
                                        ZEXT416((uint)fVar264),ZEXT416((uint)fVar254));
              fVar255 = auVar90._0_4_;
              fVar264 = fVar253 * (fVar264 / fVar255) - fVar173 * (auVar88._0_4_ / fVar255);
              auVar231 = ZEXT464((uint)fVar264);
              fVar248 = fVar248 - (fVar173 * (fVar254 / fVar255) -
                                  fVar253 * (auVar84._0_4_ / fVar255));
              fVar249 = fVar249 - fVar264;
              auVar84 = vandps_avx(auVar24,auVar261);
              if (auVar86._0_4_ <= auVar84._0_4_) {
LAB_01c6ed3c:
                bVar10 = false;
              }
              else {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar89._0_4_)),local_750,
                                          ZEXT416(0x36000000));
                auVar84 = vandps_avx(auVar261,ZEXT416((uint)fVar253));
                if (auVar88._0_4_ <= auVar84._0_4_) goto LAB_01c6ed3c;
                fVar249 = fVar249 + (float)local_740._0_4_;
                bVar10 = true;
                if (fVar148 <= fVar249) {
                  fVar264 = *(float *)(ray + k * 4 + 0x80);
                  auVar231 = ZEXT464((uint)fVar264);
                  if (((fVar249 <= fVar264) && (0.0 <= fVar248)) && (fVar248 <= 1.0)) {
                    auVar139._0_16_ = ZEXT816(0) << 0x20;
                    auVar138._4_28_ = auVar139._4_28_;
                    auVar138._0_4_ = local_7e0._0_4_;
                    auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar138._0_16_);
                    fVar173 = auVar84._0_4_;
                    auVar84 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                    pGVar4 = (context->scene->geometries).items[uVar70].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
LAB_01c6efd0:
                      auVar231 = ZEXT464((uint)fVar264);
                    }
                    else {
                      fVar173 = fVar173 * 1.5 + auVar84._0_4_ * fVar173 * fVar173 * fVar173;
                      auVar187._0_4_ = local_7c0._0_4_ * fVar173;
                      auVar187._4_4_ = local_7c0._4_4_ * fVar173;
                      auVar187._8_4_ = local_7c0._8_4_ * fVar173;
                      auVar187._12_4_ = local_7c0._12_4_ * fVar173;
                      auVar88 = vfmadd213ps_fma(auVar83,auVar187,auVar87);
                      auVar84 = vshufps_avx(auVar187,auVar187,0xc9);
                      auVar83 = vshufps_avx(auVar87,auVar87,0xc9);
                      auVar188._0_4_ = auVar187._0_4_ * auVar83._0_4_;
                      auVar188._4_4_ = auVar187._4_4_ * auVar83._4_4_;
                      auVar188._8_4_ = auVar187._8_4_ * auVar83._8_4_;
                      auVar188._12_4_ = auVar187._12_4_ * auVar83._12_4_;
                      auVar87 = vfmsub231ps_fma(auVar188,auVar87,auVar84);
                      auVar84 = vshufps_avx(auVar87,auVar87,0xc9);
                      auVar83 = vshufps_avx(auVar88,auVar88,0xc9);
                      auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                      auVar160._0_4_ = auVar88._0_4_ * auVar87._0_4_;
                      auVar160._4_4_ = auVar88._4_4_ * auVar87._4_4_;
                      auVar160._8_4_ = auVar88._8_4_ * auVar87._8_4_;
                      auVar160._12_4_ = auVar88._12_4_ * auVar87._12_4_;
                      auVar84 = vfmsub231ps_fma(auVar160,auVar84,auVar83);
                      uVar265 = auVar84._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar249;
                        uVar3 = vextractps_avx(auVar84,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                        uVar3 = vextractps_avx(auVar84,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar265;
                        *(float *)(ray + k * 4 + 0xf0) = fVar248;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_808;
                        *(uint *)(ray + k * 4 + 0x120) = uVar70;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_5e0 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                        auStack_5d0 = vshufps_avx(auVar84,auVar84,0xaa);
                        local_5c0 = uVar265;
                        uStack_5bc = uVar265;
                        uStack_5b8 = uVar265;
                        uStack_5b4 = uVar265;
                        local_5b0 = fVar248;
                        fStack_5ac = fVar248;
                        fStack_5a8 = fVar248;
                        fStack_5a4 = fVar248;
                        local_5a0 = ZEXT416(0) << 0x20;
                        local_590 = local_600._0_8_;
                        uStack_588 = local_600._8_8_;
                        local_580 = local_5f0;
                        vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                        uStack_56c = context->user->instID[0];
                        local_570 = uStack_56c;
                        uStack_568 = uStack_56c;
                        uStack_564 = uStack_56c;
                        uStack_560 = context->user->instPrimID[0];
                        uStack_55c = uStack_560;
                        uStack_558 = uStack_560;
                        uStack_554 = uStack_560;
                        *(float *)(ray + k * 4 + 0x80) = fVar249;
                        local_8e0 = local_610._0_8_;
                        uStack_8d8 = local_610._8_8_;
                        local_860.valid = (int *)&local_8e0;
                        local_860.geometryUserPtr = pGVar4->userPtr;
                        local_860.context = context->user;
                        local_860.hit = local_5e0;
                        local_860.N = 4;
                        local_860.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->intersectionFilterN)(&local_860);
                          auVar269 = ZEXT3264(local_800);
                          auVar271 = ZEXT3264(local_8a0);
                          auVar270 = ZEXT3264(local_880);
                        }
                        auVar63._8_8_ = uStack_8d8;
                        auVar63._0_8_ = local_8e0;
                        uVar77 = vptestmd_avx512vl(auVar63,auVar63);
                        if ((uVar77 & 0xf) != 0) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_860);
                            auVar269 = ZEXT3264(local_800);
                            auVar271 = ZEXT3264(local_8a0);
                            auVar270 = ZEXT3264(local_880);
                          }
                          auVar64._8_8_ = uStack_8d8;
                          auVar64._0_8_ = local_8e0;
                          uVar77 = vptestmd_avx512vl(auVar64,auVar64);
                          uVar77 = uVar77 & 0xf;
                          bVar69 = (byte)uVar77;
                          if (bVar69 != 0) {
                            iVar58 = *(int *)(local_860.hit + 4);
                            iVar59 = *(int *)(local_860.hit + 8);
                            iVar60 = *(int *)(local_860.hit + 0xc);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar12 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_860.ray + 0xc0) =
                                 (uint)(bVar69 & 1) * *(int *)local_860.hit |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_860.ray + 0xc0);
                            *(uint *)(local_860.ray + 0xc4) =
                                 (uint)bVar76 * iVar58 |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0xc4);
                            *(uint *)(local_860.ray + 200) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_860.ray + 200);
                            *(uint *)(local_860.ray + 0xcc) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_860.ray + 0xcc);
                            iVar58 = *(int *)(local_860.hit + 0x14);
                            iVar59 = *(int *)(local_860.hit + 0x18);
                            iVar60 = *(int *)(local_860.hit + 0x1c);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar12 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_860.ray + 0xd0) =
                                 (uint)(bVar69 & 1) * *(int *)(local_860.hit + 0x10) |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_860.ray + 0xd0);
                            *(uint *)(local_860.ray + 0xd4) =
                                 (uint)bVar76 * iVar58 |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0xd4);
                            *(uint *)(local_860.ray + 0xd8) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_860.ray + 0xd8);
                            *(uint *)(local_860.ray + 0xdc) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_860.ray + 0xdc);
                            iVar58 = *(int *)(local_860.hit + 0x24);
                            iVar59 = *(int *)(local_860.hit + 0x28);
                            iVar60 = *(int *)(local_860.hit + 0x2c);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar12 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_860.ray + 0xe0) =
                                 (uint)(bVar69 & 1) * *(int *)(local_860.hit + 0x20) |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_860.ray + 0xe0);
                            *(uint *)(local_860.ray + 0xe4) =
                                 (uint)bVar76 * iVar58 |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0xe4);
                            *(uint *)(local_860.ray + 0xe8) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_860.ray + 0xe8);
                            *(uint *)(local_860.ray + 0xec) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_860.ray + 0xec);
                            iVar58 = *(int *)(local_860.hit + 0x34);
                            iVar59 = *(int *)(local_860.hit + 0x38);
                            iVar60 = *(int *)(local_860.hit + 0x3c);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar11 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar12 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_860.ray + 0xf0) =
                                 (uint)(bVar69 & 1) * *(int *)(local_860.hit + 0x30) |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_860.ray + 0xf0);
                            *(uint *)(local_860.ray + 0xf4) =
                                 (uint)bVar76 * iVar58 |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0xf4);
                            *(uint *)(local_860.ray + 0xf8) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_860.ray + 0xf8);
                            *(uint *)(local_860.ray + 0xfc) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_860.ray + 0xfc);
                            auVar93._0_4_ =
                                 (uint)(bVar69 & 1) * *(int *)(local_860.hit + 0x40) |
                                 (uint)!(bool)(bVar69 & 1) * *(int *)(local_860.ray + 0x100);
                            bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
                            auVar93._4_4_ =
                                 (uint)bVar76 * *(int *)(local_860.hit + 0x44) |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0x104);
                            bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
                            auVar93._8_4_ =
                                 (uint)bVar76 * *(int *)(local_860.hit + 0x48) |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0x108);
                            bVar76 = SUB81(uVar77 >> 3,0);
                            auVar93._12_4_ =
                                 (uint)bVar76 * *(int *)(local_860.hit + 0x4c) |
                                 (uint)!bVar76 * *(int *)(local_860.ray + 0x10c);
                            *(undefined1 (*) [16])(local_860.ray + 0x100) = auVar93;
                            auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x50));
                            *(undefined1 (*) [16])(local_860.ray + 0x110) = auVar84;
                            auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x60));
                            *(undefined1 (*) [16])(local_860.ray + 0x120) = auVar84;
                            auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x70));
                            *(undefined1 (*) [16])(local_860.ray + 0x130) = auVar84;
                            auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x80));
                            *(undefined1 (*) [16])(local_860.ray + 0x140) = auVar84;
                            goto LAB_01c6efd0;
                          }
                        }
                        auVar231 = ZEXT464((uint)fVar264);
                        *(float *)(ray + k * 4 + 0x80) = fVar264;
                      }
                    }
                  }
                }
              }
              bVar76 = lVar75 != 0;
              lVar75 = lVar75 + -1;
            } while ((!bVar10) && (bVar76));
            auVar66._4_4_ = fStack_51c;
            auVar66._0_4_ = local_520;
            auVar66._8_4_ = fStack_518;
            auVar66._12_4_ = fStack_514;
            auVar66._16_4_ = fStack_510;
            auVar66._20_4_ = fStack_50c;
            auVar66._24_4_ = fStack_508;
            auVar66._28_4_ = fStack_504;
            uVar265 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar48._4_4_ = uVar265;
            auVar48._0_4_ = uVar265;
            auVar48._8_4_ = uVar265;
            auVar48._12_4_ = uVar265;
            auVar48._16_4_ = uVar265;
            auVar48._20_4_ = uVar265;
            auVar48._24_4_ = uVar265;
            auVar48._28_4_ = uVar265;
            uVar25 = vcmpps_avx512vl(auVar66,auVar48,2);
            bVar73 = ~('\x01' << ((byte)iVar28 & 0x1f)) & bVar73 & (byte)uVar25;
          } while (bVar73 != 0);
        }
        uVar26 = vpcmpd_avx512vl(local_4a0,_local_540,1);
        uVar27 = vpcmpd_avx512vl(local_4a0,local_420,1);
        auVar194._0_4_ = (float)local_780._0_4_ + (float)local_1c0._0_4_;
        auVar194._4_4_ = (float)local_780._4_4_ + (float)local_1c0._4_4_;
        auVar194._8_4_ = fStack_778 + fStack_1b8;
        auVar194._12_4_ = fStack_774 + fStack_1b4;
        auVar194._16_4_ = fStack_770 + fStack_1b0;
        auVar194._20_4_ = fStack_76c + fStack_1ac;
        auVar194._24_4_ = fStack_768 + fStack_1a8;
        auVar194._28_4_ = fStack_764 + fStack_1a4;
        uVar265 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar213._4_4_ = uVar265;
        auVar213._0_4_ = uVar265;
        auVar213._8_4_ = uVar265;
        auVar213._12_4_ = uVar265;
        auVar213._16_4_ = uVar265;
        auVar213._20_4_ = uVar265;
        auVar213._24_4_ = uVar265;
        auVar213._28_4_ = uVar265;
        uVar25 = vcmpps_avx512vl(auVar194,auVar213,2);
        bVar73 = (byte)local_8b0 & (byte)uVar27 & (byte)uVar25;
        auVar220._0_4_ = (float)local_780._0_4_ + (float)local_460._0_4_;
        auVar220._4_4_ = (float)local_780._4_4_ + (float)local_460._4_4_;
        auVar220._8_4_ = fStack_778 + fStack_458;
        auVar220._12_4_ = fStack_774 + fStack_454;
        auVar220._16_4_ = fStack_770 + fStack_450;
        auVar220._20_4_ = fStack_76c + fStack_44c;
        auVar220._24_4_ = fStack_768 + fStack_448;
        auVar220._28_4_ = fStack_764 + fStack_444;
        auVar221 = ZEXT3264(auVar220);
        uVar25 = vcmpps_avx512vl(auVar220,auVar213,2);
        bVar71 = bVar71 & (byte)uVar26 & (byte)uVar25 | bVar73;
        uVar77 = local_8c0;
        prim = local_818;
        if (bVar71 == 0) {
          auVar262 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar263 = ZEXT3264(_DAT_02020f20);
        }
        else {
          uVar78 = local_8c8 & 0xffffffff;
          abStack_180[uVar78 * 0x60] = bVar71;
          auVar140._0_4_ =
               (uint)(bVar73 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar73 & 1) * local_460._0_4_;
          bVar10 = (bool)(bVar73 >> 1 & 1);
          auVar140._4_4_ = (uint)bVar10 * local_1c0._4_4_ | (uint)!bVar10 * local_460._4_4_;
          bVar10 = (bool)(bVar73 >> 2 & 1);
          auVar140._8_4_ = (uint)bVar10 * (int)fStack_1b8 | (uint)!bVar10 * (int)fStack_458;
          bVar10 = (bool)(bVar73 >> 3 & 1);
          auVar140._12_4_ = (uint)bVar10 * (int)fStack_1b4 | (uint)!bVar10 * (int)fStack_454;
          bVar10 = (bool)(bVar73 >> 4 & 1);
          auVar140._16_4_ = (uint)bVar10 * (int)fStack_1b0 | (uint)!bVar10 * (int)fStack_450;
          bVar10 = (bool)(bVar73 >> 5 & 1);
          auVar140._20_4_ = (uint)bVar10 * (int)fStack_1ac | (uint)!bVar10 * (int)fStack_44c;
          bVar10 = (bool)(bVar73 >> 6 & 1);
          auVar140._24_4_ = (uint)bVar10 * (int)fStack_1a8 | (uint)!bVar10 * (int)fStack_448;
          auVar140._28_4_ =
               (uint)(bVar73 >> 7) * (int)fStack_1a4 | (uint)!(bool)(bVar73 >> 7) * (int)fStack_444;
          *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar140;
          uVar25 = vmovlps_avx(local_830);
          *(undefined8 *)(afStack_140 + uVar78 * 0x18) = uVar25;
          auStack_138[uVar78 * 0x18] = (int)local_810 + 1;
          local_8c8 = (ulong)((int)local_8c8 + 1);
          auVar262 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar263 = ZEXT3264(_DAT_02020f20);
        }
      }
    }
    auVar214 = ZEXT1664(local_830);
    local_8c8 = local_8c8 & 0xffffffff;
    do {
      if ((int)local_8c8 == 0) {
        uVar265 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar41._4_4_ = uVar265;
        auVar41._0_4_ = uVar265;
        auVar41._8_4_ = uVar265;
        auVar41._12_4_ = uVar265;
        uVar25 = vcmpps_avx512vl(local_4b0,auVar41,2);
        uVar70 = (uint)uVar25 & (uint)uVar77 - 1 & (uint)uVar77;
        uVar77 = (ulong)uVar70;
        if (uVar70 == 0) {
          return;
        }
        goto LAB_01c6ca8a;
      }
      uVar78 = (ulong)((int)local_8c8 - 1);
      lVar75 = uVar78 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar75);
      auVar191._0_4_ = (float)local_780._0_4_ + auVar94._0_4_;
      auVar191._4_4_ = (float)local_780._4_4_ + auVar94._4_4_;
      auVar191._8_4_ = fStack_778 + auVar94._8_4_;
      auVar191._12_4_ = fStack_774 + auVar94._12_4_;
      auVar191._16_4_ = fStack_770 + auVar94._16_4_;
      auVar191._20_4_ = fStack_76c + auVar94._20_4_;
      auVar191._24_4_ = fStack_768 + auVar94._24_4_;
      auVar191._28_4_ = fStack_764 + auVar94._28_4_;
      uVar265 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar49._4_4_ = uVar265;
      auVar49._0_4_ = uVar265;
      auVar49._8_4_ = uVar265;
      auVar49._12_4_ = uVar265;
      auVar49._16_4_ = uVar265;
      auVar49._20_4_ = uVar265;
      auVar49._24_4_ = uVar265;
      auVar49._28_4_ = uVar265;
      uVar25 = vcmpps_avx512vl(auVar191,auVar49,2);
      uVar79 = (uint)uVar25 & (uint)abStack_180[lVar75];
      bVar71 = (byte)uVar79;
      if (uVar79 != 0) {
        auVar192._8_4_ = 0x7f800000;
        auVar192._0_8_ = 0x7f8000007f800000;
        auVar192._12_4_ = 0x7f800000;
        auVar192._16_4_ = 0x7f800000;
        auVar192._20_4_ = 0x7f800000;
        auVar192._24_4_ = 0x7f800000;
        auVar192._28_4_ = 0x7f800000;
        auVar95 = vblendmps_avx512vl(auVar192,auVar94);
        auVar133._0_4_ =
             (uint)(bVar71 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar71 & 1) * (int)auVar94._0_4_;
        bVar10 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * (int)auVar94._4_4_;
        bVar10 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * (int)auVar94._8_4_;
        bVar10 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * (int)auVar94._12_4_;
        bVar10 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar10 * auVar95._16_4_ | (uint)!bVar10 * (int)auVar94._16_4_;
        bVar10 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar10 * auVar95._20_4_ | (uint)!bVar10 * (int)auVar94._20_4_;
        bVar10 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar10 * auVar95._24_4_ | (uint)!bVar10 * (int)auVar94._24_4_;
        auVar133._28_4_ =
             (uVar79 >> 7) * auVar95._28_4_ | (uint)!SUB41(uVar79 >> 7,0) * (int)auVar94._28_4_;
        auVar94 = vshufps_avx(auVar133,auVar133,0xb1);
        auVar94 = vminps_avx(auVar133,auVar94);
        auVar95 = vshufpd_avx(auVar94,auVar94,5);
        auVar94 = vminps_avx(auVar94,auVar95);
        auVar95 = vpermpd_avx2(auVar94,0x4e);
        auVar94 = vminps_avx(auVar94,auVar95);
        uVar25 = vcmpps_avx512vl(auVar133,auVar94,0);
        bVar73 = (byte)uVar25 & bVar71;
        if (bVar73 != 0) {
          uVar79 = (uint)bVar73;
        }
        fVar240 = afStack_140[uVar78 * 0x18 + 1];
        uVar141 = 0;
        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
          uVar141 = uVar141 + 1;
        }
        local_810 = (ulong)auStack_138[uVar78 * 0x18];
        bVar73 = ~('\x01' << ((byte)uVar141 & 0x1f)) & bVar71;
        abStack_180[lVar75] = bVar73;
        uVar74 = uVar78;
        if (bVar73 != 0) {
          uVar74 = local_8c8;
        }
        fVar248 = afStack_140[uVar78 * 0x18];
        auVar193._4_4_ = fVar248;
        auVar193._0_4_ = fVar248;
        auVar193._8_4_ = fVar248;
        auVar193._12_4_ = fVar248;
        auVar193._16_4_ = fVar248;
        auVar193._20_4_ = fVar248;
        auVar193._24_4_ = fVar248;
        auVar193._28_4_ = fVar248;
        fVar240 = fVar240 - fVar248;
        auVar166._4_4_ = fVar240;
        auVar166._0_4_ = fVar240;
        auVar166._8_4_ = fVar240;
        auVar166._12_4_ = fVar240;
        auVar166._16_4_ = fVar240;
        auVar166._20_4_ = fVar240;
        auVar166._24_4_ = fVar240;
        auVar166._28_4_ = fVar240;
        auVar84 = vfmadd132ps_fma(auVar166,auVar193,auVar263._0_32_);
        _local_5e0 = ZEXT1632(auVar84);
        auVar214 = ZEXT864(*(ulong *)(local_5e0 + (ulong)uVar141 * 4));
        uVar78 = uVar74;
      }
      local_8c8 = uVar78;
    } while (bVar71 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }